

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx2::CurveNiIntersector1<4>::
     intersect_t<embree::avx2::SweepCurve1Intersector1<embree::CatmullRomCurveT>,embree::avx2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  Primitive PVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  long lVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  int iVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [12];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  uint uVar82;
  uint uVar83;
  uint uVar84;
  ulong uVar85;
  undefined1 (*pauVar86) [32];
  ulong uVar87;
  long lVar88;
  ulong uVar89;
  int iVar90;
  ulong uVar91;
  undefined4 uVar92;
  undefined8 uVar93;
  vint4 bi_2;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar94 [16];
  float fVar126;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar108 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  vint4 bi_1;
  undefined1 auVar144 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar142 [64];
  undefined1 auVar143 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [64];
  undefined1 auVar168 [64];
  vint4 ai_2;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  float fVar188;
  float fVar203;
  vint4 ai;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  float fVar204;
  float fVar213;
  float fVar214;
  vint4 bi;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar215;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar216;
  float fVar217;
  float fVar218;
  undefined1 auVar212 [32];
  undefined1 auVar219 [64];
  float fVar220;
  undefined1 auVar222 [16];
  float fVar227;
  float fVar228;
  undefined1 auVar221 [16];
  float fVar230;
  float fVar231;
  undefined1 auVar223 [32];
  float fVar229;
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [64];
  float fVar232;
  float fVar244;
  float fVar245;
  vint4 ai_1;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  float fVar246;
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [64];
  undefined1 auVar247 [16];
  undefined1 auVar248 [32];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  float fVar254;
  undefined1 auVar253 [32];
  undefined1 auVar255 [16];
  undefined1 auVar256 [32];
  undefined1 auVar257 [64];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  float fVar263;
  float fVar264;
  float fVar265;
  float fVar266;
  undefined1 auVar262 [64];
  float s;
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  float fVar275;
  float fVar276;
  float fVar277;
  undefined1 auVar273 [64];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [32];
  float fVar281;
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar285;
  float fVar286;
  float fVar287;
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  int local_acc;
  float local_aa0;
  float fStack_a9c;
  float fStack_a98;
  float fStack_a94;
  RTCFilterFunctionNArguments local_a78;
  int local_a44;
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_990 [16];
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  undefined1 local_970 [16];
  undefined1 local_960 [16];
  undefined1 local_950 [16];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined8 local_8b0;
  float local_8a8;
  float local_8a4;
  undefined4 local_8a0;
  uint local_89c;
  uint local_898;
  uint local_894;
  uint local_890;
  undefined8 local_880;
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined4 uStack_864;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_7f0 [16];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  undefined1 local_7a0 [32];
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined4 local_740;
  undefined4 uStack_73c;
  undefined4 uStack_738;
  undefined4 uStack_734;
  undefined4 uStack_730;
  undefined4 uStack_72c;
  undefined4 uStack_728;
  undefined4 uStack_724;
  uint local_720;
  uint uStack_71c;
  uint uStack_718;
  uint uStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  uint uStack_704;
  float local_700;
  float fStack_6fc;
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  undefined4 uStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined4 local_400;
  undefined4 uStack_3fc;
  undefined4 uStack_3f8;
  undefined4 uStack_3f4;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  undefined4 uStack_3e4;
  undefined4 local_3e0;
  undefined4 uStack_3dc;
  undefined4 uStack_3d8;
  undefined4 uStack_3d4;
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined4 local_240;
  undefined4 uStack_23c;
  undefined4 uStack_238;
  undefined4 uStack_234;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  undefined4 uStack_228;
  undefined4 uStack_224;
  undefined1 local_220 [32];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  undefined1 auVar274 [64];
  
  PVar3 = prim[1];
  uVar89 = (ulong)(byte)PVar3;
  fVar188 = *(float *)(prim + uVar89 * 0x19 + 0x12);
  auVar144 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + uVar89 * 0x19 + 6));
  auVar94._0_4_ = fVar188 * auVar144._0_4_;
  auVar94._4_4_ = fVar188 * auVar144._4_4_;
  auVar94._8_4_ = fVar188 * auVar144._8_4_;
  auVar94._12_4_ = fVar188 * auVar144._12_4_;
  auVar205._0_4_ = fVar188 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar205._4_4_ = fVar188 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar205._8_4_ = fVar188 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar205._12_4_ = fVar188 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar144 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 4 + 6)));
  auVar144 = vcvtdq2ps_avx(auVar144);
  auVar104 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 5 + 6)));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 6 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar250 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 0xb + 6)));
  auVar250 = vcvtdq2ps_avx(auVar250);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar222 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar89 + 6)));
  auVar222 = vcvtdq2ps_avx(auVar222);
  uVar85 = (ulong)(uint)((int)(uVar89 * 9) * 2);
  auVar97 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 + 6)));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 + uVar89 + 6)));
  auVar96 = vcvtdq2ps_avx(auVar96);
  uVar85 = (ulong)(uint)((int)(uVar89 * 5) << 2);
  auVar143 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 + 6)));
  auVar143 = vcvtdq2ps_avx(auVar143);
  auVar273 = ZEXT1664(auVar143);
  auVar278._4_4_ = auVar205._0_4_;
  auVar278._0_4_ = auVar205._0_4_;
  auVar278._8_4_ = auVar205._0_4_;
  auVar278._12_4_ = auVar205._0_4_;
  auVar128 = vshufps_avx(auVar205,auVar205,0x55);
  auVar95 = vshufps_avx(auVar205,auVar205,0xaa);
  fVar188 = auVar95._0_4_;
  auVar255._0_4_ = fVar188 * auVar9._0_4_;
  fVar126 = auVar95._4_4_;
  auVar255._4_4_ = fVar126 * auVar9._4_4_;
  fVar220 = auVar95._8_4_;
  auVar255._8_4_ = fVar220 * auVar9._8_4_;
  fVar227 = auVar95._12_4_;
  auVar255._12_4_ = fVar227 * auVar9._12_4_;
  auVar249._0_4_ = auVar222._0_4_ * fVar188;
  auVar249._4_4_ = auVar222._4_4_ * fVar126;
  auVar249._8_4_ = auVar222._8_4_ * fVar220;
  auVar249._12_4_ = auVar222._12_4_ * fVar227;
  auVar233._0_4_ = auVar143._0_4_ * fVar188;
  auVar233._4_4_ = auVar143._4_4_ * fVar126;
  auVar233._8_4_ = auVar143._8_4_ * fVar220;
  auVar233._12_4_ = auVar143._12_4_ * fVar227;
  auVar95 = vfmadd231ps_fma(auVar255,auVar128,auVar104);
  auVar129 = vfmadd231ps_fma(auVar249,auVar128,auVar10);
  auVar128 = vfmadd231ps_fma(auVar233,auVar96,auVar128);
  auVar169 = vfmadd231ps_fma(auVar95,auVar278,auVar144);
  auVar257 = ZEXT1664(auVar169);
  auVar129 = vfmadd231ps_fma(auVar129,auVar278,auVar250);
  auVar190 = vfmadd231ps_fma(auVar128,auVar97,auVar278);
  auVar279._4_4_ = auVar94._0_4_;
  auVar279._0_4_ = auVar94._0_4_;
  auVar279._8_4_ = auVar94._0_4_;
  auVar279._12_4_ = auVar94._0_4_;
  auVar128 = vshufps_avx(auVar94,auVar94,0x55);
  auVar95 = vshufps_avx(auVar94,auVar94,0xaa);
  fVar188 = auVar95._0_4_;
  auVar206._0_4_ = fVar188 * auVar9._0_4_;
  fVar126 = auVar95._4_4_;
  auVar206._4_4_ = fVar126 * auVar9._4_4_;
  fVar220 = auVar95._8_4_;
  auVar206._8_4_ = fVar220 * auVar9._8_4_;
  fVar227 = auVar95._12_4_;
  auVar206._12_4_ = fVar227 * auVar9._12_4_;
  auVar127._0_4_ = auVar222._0_4_ * fVar188;
  auVar127._4_4_ = auVar222._4_4_ * fVar126;
  auVar127._8_4_ = auVar222._8_4_ * fVar220;
  auVar127._12_4_ = auVar222._12_4_ * fVar227;
  auVar95._0_4_ = auVar143._0_4_ * fVar188;
  auVar95._4_4_ = auVar143._4_4_ * fVar126;
  auVar95._8_4_ = auVar143._8_4_ * fVar220;
  auVar95._12_4_ = auVar143._12_4_ * fVar227;
  auVar104 = vfmadd231ps_fma(auVar206,auVar128,auVar104);
  auVar9 = vfmadd231ps_fma(auVar127,auVar128,auVar10);
  auVar10 = vfmadd231ps_fma(auVar95,auVar128,auVar96);
  auVar222 = vfmadd231ps_fma(auVar104,auVar279,auVar144);
  auVar96 = vfmadd231ps_fma(auVar9,auVar279,auVar250);
  auVar143 = vfmadd231ps_fma(auVar10,auVar279,auVar97);
  local_990._8_4_ = 0x7fffffff;
  local_990._0_8_ = 0x7fffffff7fffffff;
  local_990._12_4_ = 0x7fffffff;
  auVar144 = vandps_avx(auVar169,local_990);
  auVar189._8_4_ = 0x219392ef;
  auVar189._0_8_ = 0x219392ef219392ef;
  auVar189._12_4_ = 0x219392ef;
  auVar144 = vcmpps_avx(auVar144,auVar189,1);
  auVar104 = vblendvps_avx(auVar169,auVar189,auVar144);
  auVar144 = vandps_avx(auVar129,local_990);
  auVar144 = vcmpps_avx(auVar144,auVar189,1);
  auVar9 = vblendvps_avx(auVar129,auVar189,auVar144);
  auVar144 = vandps_avx(auVar190,local_990);
  auVar144 = vcmpps_avx(auVar144,auVar189,1);
  auVar144 = vblendvps_avx(auVar190,auVar189,auVar144);
  auVar250 = vrcpps_avx(auVar104);
  auVar221._8_4_ = 0x3f800000;
  auVar221._0_8_ = 0x3f8000003f800000;
  auVar221._12_4_ = 0x3f800000;
  auVar104 = vfnmadd213ps_fma(auVar104,auVar250,auVar221);
  auVar250 = vfmadd132ps_fma(auVar104,auVar250,auVar250);
  auVar104 = vrcpps_avx(auVar9);
  auVar9 = vfnmadd213ps_fma(auVar9,auVar104,auVar221);
  auVar10 = vfmadd132ps_fma(auVar9,auVar104,auVar104);
  auVar104 = vrcpps_avx(auVar144);
  auVar144 = vfnmadd213ps_fma(auVar144,auVar104,auVar221);
  auVar97 = vfmadd132ps_fma(auVar144,auVar104,auVar104);
  auVar144._8_8_ = 0;
  auVar144._0_8_ = *(ulong *)(prim + uVar89 * 7 + 6);
  auVar144 = vpmovsxwd_avx(auVar144);
  auVar144 = vcvtdq2ps_avx(auVar144);
  auVar144 = vsubps_avx(auVar144,auVar222);
  auVar190._0_4_ = auVar250._0_4_ * auVar144._0_4_;
  auVar190._4_4_ = auVar250._4_4_ * auVar144._4_4_;
  auVar190._8_4_ = auVar250._8_4_ * auVar144._8_4_;
  auVar190._12_4_ = auVar250._12_4_ * auVar144._12_4_;
  auVar104._8_8_ = 0;
  auVar104._0_8_ = *(ulong *)(prim + uVar89 * 9 + 6);
  auVar144 = vpmovsxwd_avx(auVar104);
  auVar144 = vcvtdq2ps_avx(auVar144);
  auVar144 = vsubps_avx(auVar144,auVar222);
  auVar207._0_4_ = auVar250._0_4_ * auVar144._0_4_;
  auVar207._4_4_ = auVar250._4_4_ * auVar144._4_4_;
  auVar207._8_4_ = auVar250._8_4_ * auVar144._8_4_;
  auVar207._12_4_ = auVar250._12_4_ * auVar144._12_4_;
  auVar129._1_3_ = 0;
  auVar129[0] = PVar3;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar104 = vpmovsxwd_avx(auVar9);
  auVar250._8_8_ = 0;
  auVar250._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar89 * -2 + 6);
  auVar144 = vpmovsxwd_avx(auVar250);
  auVar144 = vcvtdq2ps_avx(auVar144);
  auVar144 = vsubps_avx(auVar144,auVar96);
  auVar234._0_4_ = auVar144._0_4_ * auVar10._0_4_;
  auVar234._4_4_ = auVar144._4_4_ * auVar10._4_4_;
  auVar234._8_4_ = auVar144._8_4_ * auVar10._8_4_;
  auVar234._12_4_ = auVar144._12_4_ * auVar10._12_4_;
  auVar144 = vcvtdq2ps_avx(auVar104);
  auVar144 = vsubps_avx(auVar144,auVar96);
  auVar128._0_4_ = auVar10._0_4_ * auVar144._0_4_;
  auVar128._4_4_ = auVar10._4_4_ * auVar144._4_4_;
  auVar128._8_4_ = auVar10._8_4_ * auVar144._8_4_;
  auVar128._12_4_ = auVar10._12_4_ * auVar144._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar85 + uVar89 + 6);
  auVar144 = vpmovsxwd_avx(auVar10);
  auVar144 = vcvtdq2ps_avx(auVar144);
  auVar144 = vsubps_avx(auVar144,auVar143);
  auVar169._0_4_ = auVar97._0_4_ * auVar144._0_4_;
  auVar169._4_4_ = auVar97._4_4_ * auVar144._4_4_;
  auVar169._8_4_ = auVar97._8_4_ * auVar144._8_4_;
  auVar169._12_4_ = auVar97._12_4_ * auVar144._12_4_;
  auVar222._8_8_ = 0;
  auVar222._0_8_ = *(ulong *)(prim + uVar89 * 0x17 + 6);
  auVar144 = vpmovsxwd_avx(auVar222);
  auVar144 = vcvtdq2ps_avx(auVar144);
  auVar144 = vsubps_avx(auVar144,auVar143);
  auVar96._0_4_ = auVar97._0_4_ * auVar144._0_4_;
  auVar96._4_4_ = auVar97._4_4_ * auVar144._4_4_;
  auVar96._8_4_ = auVar97._8_4_ * auVar144._8_4_;
  auVar96._12_4_ = auVar97._12_4_ * auVar144._12_4_;
  auVar144 = vpminsd_avx(auVar190,auVar207);
  auVar104 = vpminsd_avx(auVar234,auVar128);
  auVar144 = vmaxps_avx(auVar144,auVar104);
  auVar104 = vpminsd_avx(auVar169,auVar96);
  uVar92 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar247._4_4_ = uVar92;
  auVar247._0_4_ = uVar92;
  auVar247._8_4_ = uVar92;
  auVar247._12_4_ = uVar92;
  auVar104 = vmaxps_avx(auVar104,auVar247);
  auVar144 = vmaxps_avx(auVar144,auVar104);
  local_4e0._0_4_ = auVar144._0_4_ * 0.99999964;
  local_4e0._4_4_ = auVar144._4_4_ * 0.99999964;
  local_4e0._8_4_ = auVar144._8_4_ * 0.99999964;
  local_4e0._12_4_ = auVar144._12_4_ * 0.99999964;
  auVar144 = vpmaxsd_avx(auVar190,auVar207);
  auVar104 = vpmaxsd_avx(auVar234,auVar128);
  auVar144 = vminps_avx(auVar144,auVar104);
  auVar104 = vpmaxsd_avx(auVar169,auVar96);
  fVar188 = (ray->super_RayK<1>).tfar;
  auVar143._4_4_ = fVar188;
  auVar143._0_4_ = fVar188;
  auVar143._8_4_ = fVar188;
  auVar143._12_4_ = fVar188;
  auVar104 = vminps_avx(auVar104,auVar143);
  auVar144 = vminps_avx(auVar144,auVar104);
  auVar97._0_4_ = auVar144._0_4_ * 1.0000004;
  auVar97._4_4_ = auVar144._4_4_ * 1.0000004;
  auVar97._8_4_ = auVar144._8_4_ * 1.0000004;
  auVar97._12_4_ = auVar144._12_4_ * 1.0000004;
  auVar129[4] = PVar3;
  auVar129._5_3_ = 0;
  auVar129[8] = PVar3;
  auVar129._9_3_ = 0;
  auVar129[0xc] = PVar3;
  auVar129._13_3_ = 0;
  auVar104 = vpcmpgtd_avx(auVar129,_DAT_01f7fcf0);
  auVar144 = vcmpps_avx(local_4e0,auVar97,2);
  auVar144 = vandps_avx(auVar144,auVar104);
  uVar82 = vmovmskps_avx(auVar144);
  if (uVar82 == 0) {
    return;
  }
  uVar82 = uVar82 & 0xff;
  auVar110._16_16_ = mm_lookupmask_ps._240_16_;
  auVar110._0_16_ = mm_lookupmask_ps._240_16_;
  local_420 = vblendps_avx(auVar110,ZEXT832(0) << 0x20,0x80);
  auVar262 = ZEXT3264(local_420);
  local_740 = 0x7fffffff;
  uStack_73c = 0x7fffffff;
  uStack_738 = 0x7fffffff;
  uStack_734 = 0x7fffffff;
  uStack_730 = 0x7fffffff;
  uStack_72c = 0x7fffffff;
  uStack_728 = 0x7fffffff;
  uStack_724 = 0x7fffffff;
  local_720 = 0x80000000;
  uStack_71c = 0x80000000;
  uStack_718 = 0x80000000;
  uStack_714 = 0x80000000;
  fStack_710 = -0.0;
  fStack_70c = -0.0;
  fStack_708 = -0.0;
  uStack_704 = 0x80000000;
LAB_0160249d:
  lVar88 = 0;
  uVar89 = (ulong)uVar82;
  for (uVar85 = uVar89; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x8000000000000000) {
    lVar88 = lVar88 + 1;
  }
  uVar82 = *(uint *)(prim + 2);
  pGVar4 = (context->scene->geometries).items[uVar82].ptr;
  uVar85 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar88 * 4 + 6));
  p_Var5 = pGVar4[1].intersectionFilterN;
  lVar6 = *(long *)&pGVar4[1].time_range.upper;
  auVar144 = *(undefined1 (*) [16])(lVar6 + (long)p_Var5 * uVar85);
  auVar104 = *(undefined1 (*) [16])(lVar6 + (uVar85 + 1) * (long)p_Var5);
  uVar89 = uVar89 - 1 & uVar89;
  if (uVar89 != 0) {
    uVar87 = uVar89 - 1 & uVar89;
    for (uVar91 = uVar89; (uVar91 & 1) == 0; uVar91 = uVar91 >> 1 | 0x8000000000000000) {
    }
    if (uVar87 != 0) {
      for (; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar208._0_4_ = (auVar144._0_4_ + auVar104._0_4_) * 0.5;
  auVar208._4_4_ = (auVar144._4_4_ + auVar104._4_4_) * 0.5;
  auVar208._8_4_ = (auVar144._8_4_ + auVar104._8_4_) * 0.5;
  auVar208._12_4_ = (auVar144._12_4_ + auVar104._12_4_) * 0.5;
  aVar1 = (ray->super_RayK<1>).org.field_0;
  aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar9 = vsubps_avx(auVar208,(undefined1  [16])aVar1);
  auVar9 = vdpps_avx(auVar9,(undefined1  [16])aVar2,0x7f);
  auVar250 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  auVar10 = vrcpss_avx(auVar250,auVar250);
  auVar243 = ZEXT1664(auVar10);
  auVar250 = vfnmadd213ss_fma(auVar10,auVar250,ZEXT416(0x40000000));
  fVar188 = auVar9._0_4_ * auVar10._0_4_ * auVar250._0_4_;
  local_7f0 = ZEXT416((uint)fVar188);
  auVar209._4_4_ = fVar188;
  auVar209._0_4_ = fVar188;
  auVar209._8_4_ = fVar188;
  auVar209._12_4_ = fVar188;
  fStack_810 = fVar188;
  _local_820 = auVar209;
  fStack_80c = fVar188;
  fStack_808 = fVar188;
  fStack_804 = fVar188;
  auVar9 = vfmadd231ps_fma((undefined1  [16])aVar1,(undefined1  [16])aVar2,auVar209);
  auVar9 = vblendps_avx(auVar9,_DAT_01f7aa10,8);
  local_950 = vsubps_avx(auVar144,auVar9);
  local_960 = vsubps_avx(*(undefined1 (*) [16])(lVar6 + (uVar85 + 2) * (long)p_Var5),auVar9);
  local_970 = vsubps_avx(auVar104,auVar9);
  _local_980 = vsubps_avx(*(undefined1 (*) [16])(lVar6 + (uVar85 + 3) * (long)p_Var5),auVar9);
  auVar167 = ZEXT1664(_local_980);
  auVar144 = vmovshdup_avx(local_950);
  local_2a0 = auVar144._0_8_;
  uStack_298 = local_2a0;
  uStack_290 = local_2a0;
  uStack_288 = local_2a0;
  auVar144 = vshufps_avx(local_950,local_950,0xaa);
  local_1e0 = auVar144._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar144 = vshufps_avx(local_950,local_950,0xff);
  local_2c0 = auVar144._0_8_;
  uStack_2b8 = local_2c0;
  uStack_2b0 = local_2c0;
  uStack_2a8 = local_2c0;
  auVar144 = vmovshdup_avx(local_970);
  local_200 = auVar144._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar144 = vshufps_avx(local_970,local_970,0xaa);
  local_2e0 = auVar144._0_8_;
  uStack_2d8 = local_2e0;
  uStack_2d0 = local_2e0;
  uStack_2c8 = local_2e0;
  auVar144 = vshufps_avx(local_970,local_970,0xff);
  local_300 = auVar144._0_8_;
  uStack_2f8 = local_300;
  uStack_2f0 = local_300;
  uStack_2e8 = local_300;
  auVar144 = vmovshdup_avx(local_960);
  local_320 = auVar144._0_8_;
  uStack_318 = local_320;
  uStack_310 = local_320;
  uStack_308 = local_320;
  auVar144 = vshufps_avx(local_960,local_960,0xaa);
  local_340 = auVar144._0_8_;
  uStack_338 = local_340;
  uStack_330 = local_340;
  uStack_328 = local_340;
  auVar144 = vshufps_avx(local_960,local_960,0xff);
  local_360 = auVar144._0_8_;
  uStack_358 = local_360;
  uStack_350 = local_360;
  uStack_348 = local_360;
  auVar144 = vmovshdup_avx(_local_980);
  local_380 = auVar144._0_8_;
  uStack_378 = local_380;
  uStack_370 = local_380;
  uStack_368 = local_380;
  auVar144 = vshufps_avx(_local_980,_local_980,0xaa);
  local_3a0 = auVar144._0_8_;
  uStack_398 = local_3a0;
  uStack_390 = local_3a0;
  uStack_388 = local_3a0;
  auVar144 = vshufps_avx(_local_980,_local_980,0xff);
  local_3c0 = auVar144._0_8_;
  uStack_3b8 = local_3c0;
  uStack_3b0 = local_3c0;
  uStack_3a8 = local_3c0;
  auVar98._0_4_ = aVar2.x * aVar2.x;
  auVar98._4_4_ = aVar2.y * aVar2.y;
  auVar98._8_4_ = aVar2.z * aVar2.z;
  auVar98._12_4_ = aVar2.field_3.w * aVar2.field_3.w;
  auVar144 = vshufps_avx(auVar98,auVar98,0xaa);
  uVar93 = auVar144._0_8_;
  auVar223._8_8_ = uVar93;
  auVar223._0_8_ = uVar93;
  auVar223._16_8_ = uVar93;
  auVar223._24_8_ = uVar93;
  uVar92 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
  local_5c0._4_4_ = uVar92;
  local_5c0._0_4_ = uVar92;
  local_5c0._8_4_ = uVar92;
  local_5c0._12_4_ = uVar92;
  local_5c0._16_4_ = uVar92;
  local_5c0._20_4_ = uVar92;
  local_5c0._24_4_ = uVar92;
  local_5c0._28_4_ = uVar92;
  uVar92 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
  local_6e0._4_4_ = uVar92;
  local_6e0._0_4_ = uVar92;
  fStack_6d8 = (float)uVar92;
  fStack_6d4 = (float)uVar92;
  fStack_6d0 = (float)uVar92;
  fStack_6cc = (float)uVar92;
  fStack_6c8 = (float)uVar92;
  register0x0000131c = uVar92;
  auVar144 = vfmadd231ps_fma(auVar223,_local_6e0,_local_6e0);
  auVar144 = vfmadd231ps_fma(ZEXT1632(auVar144),local_5c0,local_5c0);
  auVar226 = ZEXT1664(auVar144);
  local_acc = 1;
  uVar91 = 0;
  local_700 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fStack_6fc = local_700;
  fStack_6f8 = local_700;
  fStack_6f4 = local_700;
  fStack_6f0 = local_700;
  fStack_6ec = local_700;
  fStack_6e8 = local_700;
  fStack_6e4 = local_700;
  local_240 = local_950._0_4_;
  uStack_23c = local_240;
  uStack_238 = local_240;
  uStack_234 = local_240;
  uStack_230 = local_240;
  uStack_22c = local_240;
  uStack_228 = local_240;
  uStack_224 = local_240;
  local_3e0 = local_970._0_4_;
  uStack_3dc = local_3e0;
  uStack_3d8 = local_3e0;
  uStack_3d4 = local_3e0;
  uStack_3d0 = local_3e0;
  uStack_3cc = local_3e0;
  uStack_3c8 = local_3e0;
  uStack_3c4 = local_3e0;
  local_400 = local_960._0_4_;
  uStack_3fc = local_400;
  uStack_3f8 = local_400;
  uStack_3f4 = local_400;
  uStack_3f0 = local_400;
  uStack_3ec = local_400;
  uStack_3e8 = local_400;
  uStack_3e4 = local_400;
  local_260 = local_980._0_4_;
  auVar267._4_4_ = uStack_73c;
  auVar267._0_4_ = local_740;
  auVar267._8_4_ = uStack_738;
  auVar267._12_4_ = uStack_734;
  auVar267._16_4_ = uStack_730;
  auVar267._20_4_ = uStack_72c;
  auVar267._24_4_ = uStack_728;
  auVar267._28_4_ = uStack_724;
  local_440 = vandps_avx(ZEXT1632(auVar144),auVar267);
  auVar219 = ZEXT1664(ZEXT816(0x3f80000000000000));
  local_220 = ZEXT1632(auVar144);
  fStack_25c = local_260;
  fStack_258 = local_260;
  fStack_254 = local_260;
  fStack_250 = local_260;
  fStack_24c = local_260;
  fStack_248 = local_260;
  fStack_244 = local_260;
  uVar85 = (ulong)*(uint *)(prim + lVar88 * 4 + 6);
  do {
    auVar197._8_4_ = 0x3f800000;
    auVar197._0_8_ = 0x3f8000003f800000;
    auVar197._12_4_ = 0x3f800000;
    auVar197._16_4_ = 0x3f800000;
    auVar197._20_4_ = 0x3f800000;
    iVar90 = (int)uVar91;
    auVar197._24_4_ = 0x3f800000;
    auVar197._28_4_ = 0x3f800000;
    local_4d0 = auVar219._0_16_;
    auVar144 = vmovshdup_avx(local_4d0);
    auVar144 = vsubps_avx(auVar144,local_4d0);
    local_6a0._0_4_ = auVar144._0_4_;
    fVar188 = local_6a0._0_4_ * 0.04761905;
    local_860._0_4_ = auVar219._0_4_;
    local_860._4_4_ = local_860._0_4_;
    local_860._8_4_ = local_860._0_4_;
    local_860._12_4_ = local_860._0_4_;
    local_860._16_4_ = local_860._0_4_;
    local_860._20_4_ = local_860._0_4_;
    local_860._24_4_ = local_860._0_4_;
    local_860._28_4_ = local_860._0_4_;
    local_6a0._4_4_ = local_6a0._0_4_;
    local_6a0._8_4_ = local_6a0._0_4_;
    local_6a0._12_4_ = local_6a0._0_4_;
    local_6a0._16_4_ = local_6a0._0_4_;
    local_6a0._20_4_ = local_6a0._0_4_;
    local_6a0._24_4_ = local_6a0._0_4_;
    local_6a0._28_4_ = local_6a0._0_4_;
    auVar144 = vfmadd231ps_fma(local_860,local_6a0,_DAT_01faff20);
    auVar110 = vsubps_avx(auVar197,ZEXT1632(auVar144));
    fVar203 = auVar144._0_4_;
    fVar275 = auVar144._4_4_;
    fVar276 = auVar144._8_4_;
    fVar277 = auVar144._12_4_;
    fVar126 = auVar110._0_4_;
    fVar220 = auVar110._4_4_;
    fVar227 = auVar110._8_4_;
    fVar228 = auVar110._12_4_;
    fVar229 = auVar110._16_4_;
    fVar230 = auVar110._20_4_;
    fVar231 = auVar110._24_4_;
    auVar219._28_36_ = auVar226._28_36_;
    auVar219._0_28_ =
         ZEXT1628(CONCAT412(fVar277 * fVar277,
                            CONCAT48(fVar276 * fVar276,CONCAT44(fVar275 * fVar275,fVar203 * fVar203)
                                    )));
    fVar232 = fVar203 * 3.0;
    fVar244 = fVar275 * 3.0;
    fVar245 = fVar276 * 3.0;
    fVar246 = fVar277 * 3.0;
    fVar254 = auVar243._28_4_ + -5.0;
    auVar226._0_4_ = fVar126 * fVar126;
    auVar226._4_4_ = fVar220 * fVar220;
    auVar226._8_4_ = fVar227 * fVar227;
    auVar226._12_4_ = fVar228 * fVar228;
    auVar226._16_4_ = fVar229 * fVar229;
    auVar226._20_4_ = fVar230 * fVar230;
    auVar226._28_36_ = auVar257._28_36_;
    auVar226._24_4_ = fVar231 * fVar231;
    auVar274._0_4_ = (auVar226._0_4_ * (fVar126 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar274._4_4_ = (auVar226._4_4_ * (fVar220 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar274._8_4_ = (auVar226._8_4_ * (fVar227 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar274._12_4_ = (auVar226._12_4_ * (fVar228 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar274._16_4_ = (auVar226._16_4_ * (fVar229 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar274._20_4_ = (auVar226._20_4_ * (fVar230 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar274._28_36_ = auVar273._28_36_;
    auVar274._24_4_ = (auVar226._24_4_ * (fVar231 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar267 = auVar274._0_32_;
    fVar204 = fVar203 * fVar203 * (float)((uint)fVar126 ^ local_720) * 0.5;
    fVar213 = fVar275 * fVar275 * (float)((uint)fVar220 ^ uStack_71c) * 0.5;
    fVar214 = fVar276 * fVar276 * (float)((uint)fVar227 ^ uStack_718) * 0.5;
    fVar215 = fVar277 * fVar277 * (float)((uint)fVar228 ^ uStack_714) * 0.5;
    fVar216 = (float)((uint)fVar229 ^ (uint)fStack_710) * 0.0 * 0.0 * 0.5;
    fVar217 = (float)((uint)fVar230 ^ (uint)fStack_70c) * 0.0 * 0.0 * 0.5;
    fVar218 = (float)((uint)fVar231 ^ (uint)fStack_708) * 0.0 * 0.0 * 0.5;
    auVar11._4_4_ = fStack_25c * fVar213;
    auVar11._0_4_ = local_260 * fVar204;
    auVar11._8_4_ = fStack_258 * fVar214;
    auVar11._12_4_ = fStack_254 * fVar215;
    auVar11._16_4_ = fStack_250 * fVar216;
    auVar11._20_4_ = fStack_24c * fVar217;
    auVar11._24_4_ = fStack_248 * fVar218;
    auVar11._28_4_ = 0x40000000;
    auVar182._0_4_ = fVar204 * (float)local_380;
    auVar182._4_4_ = fVar213 * local_380._4_4_;
    auVar182._8_4_ = fVar214 * (float)uStack_378;
    auVar182._12_4_ = fVar215 * uStack_378._4_4_;
    auVar182._16_4_ = fVar216 * (float)uStack_370;
    auVar182._20_4_ = fVar217 * uStack_370._4_4_;
    auVar182._24_4_ = fVar218 * (float)uStack_368;
    auVar182._28_4_ = 0;
    auVar257._0_4_ = fVar204 * (float)local_3a0;
    auVar257._4_4_ = fVar213 * local_3a0._4_4_;
    auVar257._8_4_ = fVar214 * (float)uStack_398;
    auVar257._12_4_ = fVar215 * uStack_398._4_4_;
    auVar257._16_4_ = fVar216 * (float)uStack_390;
    auVar257._20_4_ = fVar217 * uStack_390._4_4_;
    auVar257._28_36_ = auVar167._28_36_;
    auVar257._24_4_ = fVar218 * (float)uStack_388;
    auVar13._4_4_ = fVar213 * local_3c0._4_4_;
    auVar13._0_4_ = fVar204 * (float)local_3c0;
    auVar13._8_4_ = fVar214 * (float)uStack_3b8;
    auVar13._12_4_ = fVar215 * uStack_3b8._4_4_;
    auVar13._16_4_ = fVar216 * (float)uStack_3b0;
    auVar13._20_4_ = fVar217 * uStack_3b0._4_4_;
    auVar13._24_4_ = fVar218 * (float)uStack_3a8;
    auVar13._28_4_ = auVar110._28_4_ ^ uStack_704;
    auVar268._4_4_ = uStack_3fc;
    auVar268._0_4_ = local_400;
    auVar268._8_4_ = uStack_3f8;
    auVar268._12_4_ = uStack_3f4;
    auVar268._16_4_ = uStack_3f0;
    auVar268._20_4_ = uStack_3ec;
    auVar268._24_4_ = uStack_3e8;
    auVar268._28_4_ = uStack_3e4;
    auVar144 = vfmadd231ps_fma(auVar11,auVar267,auVar268);
    auVar68._8_8_ = uStack_318;
    auVar68._0_8_ = local_320;
    auVar68._16_8_ = uStack_310;
    auVar68._24_8_ = uStack_308;
    auVar104 = vfmadd231ps_fma(auVar182,auVar267,auVar68);
    auVar66._8_8_ = uStack_338;
    auVar66._0_8_ = local_340;
    auVar66._16_8_ = uStack_330;
    auVar66._24_8_ = uStack_328;
    auVar9 = vfmadd231ps_fma(auVar257._0_32_,auVar267,auVar66);
    auVar64._8_8_ = uStack_358;
    auVar64._0_8_ = local_360;
    auVar64._16_8_ = uStack_350;
    auVar64._24_8_ = uStack_348;
    auVar250 = vfmadd231ps_fma(auVar13,auVar267,auVar64);
    auVar239._4_4_ = fVar220 * fVar220 * (float)((uint)fVar275 ^ uStack_71c) * 0.5;
    auVar239._0_4_ = fVar126 * fVar126 * (float)((uint)fVar203 ^ local_720) * 0.5;
    auVar239._8_4_ = fVar227 * fVar227 * (float)((uint)fVar276 ^ uStack_718) * 0.5;
    auVar239._12_4_ = fVar228 * fVar228 * (float)((uint)fVar277 ^ uStack_714) * 0.5;
    auVar239._16_4_ = fVar229 * fVar229 * fStack_710 * 0.5;
    auVar239._20_4_ = fVar230 * fVar230 * fStack_70c * 0.5;
    auVar239._24_4_ = fVar231 * fVar231 * fStack_708 * 0.5;
    auVar239._28_4_ = auVar262._28_4_;
    auVar7._4_4_ = ((fVar244 + -5.0) * fVar275 * fVar275 + 2.0) * 0.5;
    auVar7._0_4_ = ((fVar232 + -5.0) * fVar203 * fVar203 + 2.0) * 0.5;
    auVar7._8_4_ = ((fVar245 + -5.0) * fVar276 * fVar276 + 2.0) * 0.5;
    auVar7._12_4_ = ((fVar246 + -5.0) * fVar277 * fVar277 + 2.0) * 0.5;
    auVar7._16_4_ = 0x3f800000;
    auVar7._20_4_ = 0x3f800000;
    auVar7._24_4_ = 0x3f800000;
    auVar7._28_4_ = auVar273._28_4_ + 2.0;
    auVar62._4_4_ = uStack_3dc;
    auVar62._0_4_ = local_3e0;
    auVar62._8_4_ = uStack_3d8;
    auVar62._12_4_ = uStack_3d4;
    auVar62._16_4_ = uStack_3d0;
    auVar62._20_4_ = uStack_3cc;
    auVar62._24_4_ = uStack_3c8;
    auVar62._28_4_ = uStack_3c4;
    auVar144 = vfmadd231ps_fma(ZEXT1632(auVar144),auVar7,auVar62);
    auVar79._8_8_ = uStack_1f8;
    auVar79._0_8_ = local_200;
    auVar79._16_8_ = uStack_1f0;
    auVar79._24_8_ = uStack_1e8;
    auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar7,auVar79);
    auVar72._8_8_ = uStack_2d8;
    auVar72._0_8_ = local_2e0;
    auVar72._16_8_ = uStack_2d0;
    auVar72._24_8_ = uStack_2c8;
    auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar7,auVar72);
    auVar70._8_8_ = uStack_2f8;
    auVar70._0_8_ = local_300;
    auVar70._16_8_ = uStack_2f0;
    auVar70._24_8_ = uStack_2e8;
    auVar250 = vfmadd231ps_fma(ZEXT1632(auVar250),auVar7,auVar70);
    auVar78._4_4_ = uStack_23c;
    auVar78._0_4_ = local_240;
    auVar78._8_4_ = uStack_238;
    auVar78._12_4_ = uStack_234;
    auVar78._16_4_ = uStack_230;
    auVar78._20_4_ = uStack_22c;
    auVar78._24_4_ = uStack_228;
    auVar78._28_4_ = uStack_224;
    auVar144 = vfmadd231ps_fma(ZEXT1632(auVar144),auVar239,auVar78);
    auVar76._8_8_ = uStack_298;
    auVar76._0_8_ = local_2a0;
    auVar76._16_8_ = uStack_290;
    auVar76._24_8_ = uStack_288;
    auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar239,auVar76);
    local_a40 = ZEXT1632(auVar104);
    auVar80._8_8_ = uStack_1d8;
    auVar80._0_8_ = local_1e0;
    auVar80._16_8_ = uStack_1d0;
    auVar80._24_8_ = uStack_1c8;
    auVar104 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar239,auVar80);
    auVar74._8_8_ = uStack_2b8;
    auVar74._0_8_ = local_2c0;
    auVar74._16_8_ = uStack_2b0;
    auVar74._24_8_ = uStack_2a8;
    auVar9 = vfmadd231ps_fma(ZEXT1632(auVar250),auVar239,auVar74);
    auVar268 = ZEXT1632(auVar9);
    auVar15._4_4_ = (fVar220 + fVar220) * fVar275;
    auVar15._0_4_ = (fVar126 + fVar126) * fVar203;
    auVar15._8_4_ = (fVar227 + fVar227) * fVar276;
    auVar15._12_4_ = (fVar228 + fVar228) * fVar277;
    auVar15._16_4_ = (fVar229 + fVar229) * 0.0;
    auVar15._20_4_ = (fVar230 + fVar230) * 0.0;
    auVar15._24_4_ = (fVar231 + fVar231) * 0.0;
    auVar15._28_4_ = 0;
    auVar267 = vsubps_avx(auVar15,auVar226._0_32_);
    fVar204 = auVar243._28_4_ + 2.0;
    auVar16._4_4_ = (fVar220 + fVar220) * (fVar244 + 2.0);
    auVar16._0_4_ = (fVar126 + fVar126) * (fVar232 + 2.0);
    auVar16._8_4_ = (fVar227 + fVar227) * (fVar245 + 2.0);
    auVar16._12_4_ = (fVar228 + fVar228) * (fVar246 + 2.0);
    auVar16._16_4_ = (fVar229 + fVar229) * 2.0;
    auVar16._20_4_ = (fVar230 + fVar230) * 2.0;
    auVar16._24_4_ = (fVar231 + fVar231) * 2.0;
    auVar16._28_4_ = fVar204;
    auVar17._4_4_ = fVar220 * fVar220 * 3.0;
    auVar17._0_4_ = fVar126 * fVar126 * 3.0;
    auVar17._8_4_ = fVar227 * fVar227 * 3.0;
    auVar17._12_4_ = fVar228 * fVar228 * 3.0;
    auVar17._16_4_ = fVar229 * fVar229 * 3.0;
    auVar17._20_4_ = fVar230 * fVar230 * 3.0;
    auVar17._24_4_ = fVar231 * fVar231 * 3.0;
    auVar17._28_4_ = auVar110._28_4_;
    auVar110 = vsubps_avx(auVar16,auVar17);
    auVar223 = vsubps_avx(auVar219._0_32_,auVar15);
    auVar118._4_4_ = auVar267._4_4_ * 0.5;
    auVar118._0_4_ = auVar267._0_4_ * 0.5;
    auVar118._8_4_ = auVar267._8_4_ * 0.5;
    auVar118._12_4_ = auVar267._12_4_ * 0.5;
    auVar118._16_4_ = auVar267._16_4_ * 0.5;
    auVar118._20_4_ = auVar267._20_4_ * 0.5;
    auVar118._24_4_ = auVar267._24_4_ * 0.5;
    auVar118._28_4_ = fVar204;
    auVar280._28_4_ = fVar254 + 0.0;
    auVar280._0_28_ =
         ZEXT1628(CONCAT412(((fVar277 + fVar277) * (fVar246 + -5.0) + fVar246 * fVar277) * 0.5,
                            CONCAT48(((fVar276 + fVar276) * (fVar245 + -5.0) + fVar245 * fVar276) *
                                     0.5,CONCAT44(((fVar275 + fVar275) * (fVar244 + -5.0) +
                                                  fVar244 * fVar275) * 0.5,
                                                  ((fVar203 + fVar203) * (fVar232 + -5.0) +
                                                  fVar232 * fVar203) * 0.5))));
    auVar8._4_4_ = auVar110._4_4_ * 0.5;
    auVar8._0_4_ = auVar110._0_4_ * 0.5;
    auVar8._8_4_ = auVar110._8_4_ * 0.5;
    auVar8._12_4_ = auVar110._12_4_ * 0.5;
    auVar8._16_4_ = auVar110._16_4_ * 0.5;
    auVar8._20_4_ = auVar110._20_4_ * 0.5;
    fVar126 = auVar110._28_4_;
    auVar8._24_4_ = auVar110._24_4_ * 0.5;
    auVar8._28_4_ = fVar126;
    fVar220 = auVar223._0_4_ * 0.5;
    fVar227 = auVar223._4_4_ * 0.5;
    fVar228 = auVar223._8_4_ * 0.5;
    fVar229 = auVar223._12_4_ * 0.5;
    fVar230 = auVar223._16_4_ * 0.5;
    fVar231 = auVar223._20_4_ * 0.5;
    fVar204 = auVar223._24_4_ * 0.5;
    auVar200._4_4_ = fStack_25c * fVar227;
    auVar200._0_4_ = local_260 * fVar220;
    auVar200._8_4_ = fStack_258 * fVar228;
    auVar200._12_4_ = fStack_254 * fVar229;
    auVar200._16_4_ = fStack_250 * fVar230;
    auVar200._20_4_ = fStack_24c * fVar231;
    auVar200._24_4_ = fStack_248 * fVar204;
    auVar200._28_4_ = fStack_244;
    auVar12._4_4_ = fVar227 * local_380._4_4_;
    auVar12._0_4_ = fVar220 * (float)local_380;
    auVar12._8_4_ = fVar228 * (float)uStack_378;
    auVar12._12_4_ = fVar229 * uStack_378._4_4_;
    auVar12._16_4_ = fVar230 * (float)uStack_370;
    auVar12._20_4_ = fVar231 * uStack_370._4_4_;
    auVar12._24_4_ = fVar204 * (float)uStack_368;
    auVar12._28_4_ = fVar254;
    auVar18._4_4_ = fVar227 * local_3a0._4_4_;
    auVar18._0_4_ = fVar220 * (float)local_3a0;
    auVar18._8_4_ = fVar228 * (float)uStack_398;
    auVar18._12_4_ = fVar229 * uStack_398._4_4_;
    auVar18._16_4_ = fVar230 * (float)uStack_390;
    auVar18._20_4_ = fVar231 * uStack_390._4_4_;
    auVar18._24_4_ = fVar204 * (float)uStack_388;
    auVar18._28_4_ = auVar267._28_4_;
    auVar19._4_4_ = fVar227 * local_3c0._4_4_;
    auVar19._0_4_ = fVar220 * (float)local_3c0;
    auVar19._8_4_ = fVar228 * (float)uStack_3b8;
    auVar19._12_4_ = fVar229 * uStack_3b8._4_4_;
    auVar19._16_4_ = fVar230 * (float)uStack_3b0;
    auVar19._20_4_ = fVar231 * uStack_3b0._4_4_;
    auVar19._24_4_ = fVar204 * (float)uStack_3a8;
    auVar19._28_4_ = auVar223._28_4_;
    auVar61._4_4_ = uStack_3fc;
    auVar61._0_4_ = local_400;
    auVar61._8_4_ = uStack_3f8;
    auVar61._12_4_ = uStack_3f4;
    auVar61._16_4_ = uStack_3f0;
    auVar61._20_4_ = uStack_3ec;
    auVar61._24_4_ = uStack_3e8;
    auVar61._28_4_ = uStack_3e4;
    auVar250 = vfmadd231ps_fma(auVar200,auVar8,auVar61);
    auVar69._8_8_ = uStack_318;
    auVar69._0_8_ = local_320;
    auVar69._16_8_ = uStack_310;
    auVar69._24_8_ = uStack_308;
    auVar10 = vfmadd231ps_fma(auVar12,auVar8,auVar69);
    auVar67._8_8_ = uStack_338;
    auVar67._0_8_ = local_340;
    auVar67._16_8_ = uStack_330;
    auVar67._24_8_ = uStack_328;
    auVar222 = vfmadd231ps_fma(auVar18,auVar8,auVar67);
    auVar65._8_8_ = uStack_358;
    auVar65._0_8_ = local_360;
    auVar65._16_8_ = uStack_350;
    auVar65._24_8_ = uStack_348;
    auVar97 = vfmadd231ps_fma(auVar19,auVar8,auVar65);
    auVar63._4_4_ = uStack_3dc;
    auVar63._0_4_ = local_3e0;
    auVar63._8_4_ = uStack_3d8;
    auVar63._12_4_ = uStack_3d4;
    auVar63._16_4_ = uStack_3d0;
    auVar63._20_4_ = uStack_3cc;
    auVar63._24_4_ = uStack_3c8;
    auVar63._28_4_ = uStack_3c4;
    auVar250 = vfmadd231ps_fma(ZEXT1632(auVar250),auVar280,auVar63);
    auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar280,auVar79);
    auVar73._8_8_ = uStack_2d8;
    auVar73._0_8_ = local_2e0;
    auVar73._16_8_ = uStack_2d0;
    auVar73._24_8_ = uStack_2c8;
    auVar222 = vfmadd231ps_fma(ZEXT1632(auVar222),auVar280,auVar73);
    auVar71._8_8_ = uStack_2f8;
    auVar71._0_8_ = local_300;
    auVar71._16_8_ = uStack_2f0;
    auVar71._24_8_ = uStack_2e8;
    auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar280,auVar71);
    auVar250 = vfmadd231ps_fma(ZEXT1632(auVar250),auVar118,auVar78);
    auVar77._8_8_ = uStack_298;
    auVar77._0_8_ = local_2a0;
    auVar77._16_8_ = uStack_290;
    auVar77._24_8_ = uStack_288;
    auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar118,auVar77);
    auVar222 = vfmadd231ps_fma(ZEXT1632(auVar222),auVar118,auVar80);
    auVar75._8_8_ = uStack_2b8;
    auVar75._0_8_ = local_2c0;
    auVar75._16_8_ = uStack_2b0;
    auVar75._24_8_ = uStack_2a8;
    auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar118,auVar75);
    local_920._0_4_ = auVar250._0_4_ * fVar188;
    local_920._4_4_ = auVar250._4_4_ * fVar188;
    local_920._8_4_ = auVar250._8_4_ * fVar188;
    local_920._12_4_ = auVar250._12_4_ * fVar188;
    local_920._16_4_ = fVar188 * 0.0;
    local_920._20_4_ = fVar188 * 0.0;
    local_920._24_4_ = fVar188 * 0.0;
    local_920._28_4_ = 0;
    fVar230 = auVar10._0_4_ * fVar188;
    fVar275 = auVar10._4_4_ * fVar188;
    local_9c0._4_4_ = fVar275;
    local_9c0._0_4_ = fVar230;
    fVar276 = auVar10._8_4_ * fVar188;
    local_9c0._8_4_ = fVar276;
    fVar277 = auVar10._12_4_ * fVar188;
    local_9c0._12_4_ = fVar277;
    local_9c0._16_4_ = fVar188 * 0.0;
    local_9c0._20_4_ = fVar188 * 0.0;
    local_9c0._24_4_ = fVar188 * 0.0;
    local_9c0._28_4_ = 0;
    fVar281 = auVar222._0_4_ * fVar188;
    fVar282 = auVar222._4_4_ * fVar188;
    local_9e0._4_4_ = fVar282;
    local_9e0._0_4_ = fVar281;
    fVar283 = auVar222._8_4_ * fVar188;
    local_9e0._8_4_ = fVar283;
    fVar284 = auVar222._12_4_ * fVar188;
    local_9e0._12_4_ = fVar284;
    fVar285 = fVar188 * 0.0;
    local_9e0._16_4_ = fVar285;
    fVar286 = fVar188 * 0.0;
    local_9e0._20_4_ = fVar286;
    fVar287 = fVar188 * 0.0;
    local_9e0._24_4_ = fVar287;
    local_9e0._28_4_ = 0x3f000000;
    fVar220 = fVar188 * auVar97._0_4_;
    fVar227 = fVar188 * auVar97._4_4_;
    auVar20._4_4_ = fVar227;
    auVar20._0_4_ = fVar220;
    fVar228 = fVar188 * auVar97._8_4_;
    auVar20._8_4_ = fVar228;
    fVar229 = fVar188 * auVar97._12_4_;
    auVar20._12_4_ = fVar229;
    auVar20._16_4_ = fVar188 * 0.0;
    auVar20._20_4_ = fVar188 * 0.0;
    auVar20._24_4_ = fVar188 * 0.0;
    auVar20._28_4_ = fVar126;
    local_840 = ZEXT1632(auVar144);
    local_8e0 = vpermps_avx2(_DAT_01fec480,local_840);
    local_900 = vpermps_avx2(_DAT_01fec480,local_a40);
    local_660 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar104));
    local_540 = vsubps_avx(local_8e0,ZEXT1632(auVar144));
    local_600 = vsubps_avx(local_660,ZEXT1632(auVar104));
    local_520 = ZEXT1632(auVar104);
    fVar231 = local_600._0_4_;
    fVar204 = local_600._4_4_;
    auVar21._4_4_ = fVar204 * local_920._4_4_;
    auVar21._0_4_ = fVar231 * (float)local_920._0_4_;
    fVar213 = local_600._8_4_;
    auVar21._8_4_ = fVar213 * local_920._8_4_;
    fVar214 = local_600._12_4_;
    auVar21._12_4_ = fVar214 * local_920._12_4_;
    fVar215 = local_600._16_4_;
    auVar21._16_4_ = fVar215 * local_920._16_4_;
    fVar216 = local_600._20_4_;
    auVar21._20_4_ = fVar216 * local_920._20_4_;
    fVar217 = local_600._24_4_;
    auVar21._24_4_ = fVar217 * local_920._24_4_;
    auVar21._28_4_ = local_8e0._28_4_;
    auVar144 = vfmsub231ps_fma(auVar21,local_9e0,local_540);
    local_560 = vsubps_avx(local_900,local_a40);
    fVar218 = local_540._0_4_;
    fVar203 = local_540._4_4_;
    auVar22._4_4_ = fVar203 * fVar275;
    auVar22._0_4_ = fVar218 * fVar230;
    fVar275 = local_540._8_4_;
    auVar22._8_4_ = fVar275 * fVar276;
    fVar276 = local_540._12_4_;
    auVar22._12_4_ = fVar276 * fVar277;
    fVar277 = local_540._16_4_;
    auVar22._16_4_ = fVar277 * fVar188 * 0.0;
    fVar232 = local_540._20_4_;
    auVar22._20_4_ = fVar232 * fVar188 * 0.0;
    fVar244 = local_540._24_4_;
    auVar22._24_4_ = fVar244 * fVar188 * 0.0;
    auVar22._28_4_ = local_900._28_4_;
    auVar104 = vfmsub231ps_fma(auVar22,local_920,local_560);
    auVar144 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar104._12_4_ * auVar104._12_4_,
                                                  CONCAT48(auVar104._8_4_ * auVar104._8_4_,
                                                           CONCAT44(auVar104._4_4_ * auVar104._4_4_,
                                                                    auVar104._0_4_ * auVar104._0_4_)
                                                          ))),ZEXT1632(auVar144),ZEXT1632(auVar144))
    ;
    fVar245 = local_560._0_4_;
    fVar246 = local_560._4_4_;
    auVar23._4_4_ = fVar246 * fVar282;
    auVar23._0_4_ = fVar245 * fVar281;
    fVar254 = local_560._8_4_;
    auVar23._8_4_ = fVar254 * fVar283;
    fVar263 = local_560._12_4_;
    auVar23._12_4_ = fVar263 * fVar284;
    fVar264 = local_560._16_4_;
    auVar23._16_4_ = fVar264 * fVar285;
    fVar265 = local_560._20_4_;
    auVar23._20_4_ = fVar265 * fVar286;
    fVar266 = local_560._24_4_;
    auVar23._24_4_ = fVar266 * fVar287;
    auVar23._28_4_ = local_660._28_4_;
    auVar250 = vfmsub231ps_fma(auVar23,local_9c0,local_600);
    auVar183._0_4_ = fVar231 * fVar231;
    auVar183._4_4_ = fVar204 * fVar204;
    auVar183._8_4_ = fVar213 * fVar213;
    auVar183._12_4_ = fVar214 * fVar214;
    auVar183._16_4_ = fVar215 * fVar215;
    auVar183._20_4_ = fVar216 * fVar216;
    auVar183._24_4_ = fVar217 * fVar217;
    auVar183._28_4_ = 0;
    auVar104 = vfmadd231ps_fma(auVar183,local_560,local_560);
    auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),local_540,local_540);
    auVar110 = vrcpps_avx(ZEXT1632(auVar104));
    auVar250 = vfmadd231ps_fma(ZEXT1632(auVar144),ZEXT1632(auVar250),ZEXT1632(auVar250));
    auVar155._8_4_ = 0x3f800000;
    auVar155._0_8_ = 0x3f8000003f800000;
    auVar155._12_4_ = 0x3f800000;
    auVar155._16_4_ = 0x3f800000;
    auVar155._20_4_ = 0x3f800000;
    auVar155._24_4_ = 0x3f800000;
    auVar155._28_4_ = 0x3f800000;
    auVar144 = vfnmadd213ps_fma(auVar110,ZEXT1632(auVar104),auVar155);
    auVar144 = vfmadd132ps_fma(ZEXT1632(auVar144),auVar110,auVar110);
    local_a00 = vpermps_avx2(_DAT_01fec480,local_920);
    local_680 = vpermps_avx2(_DAT_01fec480,local_9e0);
    auVar24._4_4_ = fVar204 * local_a00._4_4_;
    auVar24._0_4_ = fVar231 * local_a00._0_4_;
    auVar24._8_4_ = fVar213 * local_a00._8_4_;
    auVar24._12_4_ = fVar214 * local_a00._12_4_;
    auVar24._16_4_ = fVar215 * local_a00._16_4_;
    auVar24._20_4_ = fVar216 * local_a00._20_4_;
    auVar24._24_4_ = fVar217 * local_a00._24_4_;
    auVar24._28_4_ = auVar110._28_4_;
    auVar10 = vfmsub231ps_fma(auVar24,local_680,local_540);
    local_a20 = vpermps_avx2(_DAT_01fec480,local_9c0);
    auVar25._4_4_ = fVar203 * local_a20._4_4_;
    auVar25._0_4_ = fVar218 * local_a20._0_4_;
    auVar25._8_4_ = fVar275 * local_a20._8_4_;
    auVar25._12_4_ = fVar276 * local_a20._12_4_;
    auVar25._16_4_ = fVar277 * local_a20._16_4_;
    auVar25._20_4_ = fVar232 * local_a20._20_4_;
    auVar25._24_4_ = fVar244 * local_a20._24_4_;
    auVar25._28_4_ = 0;
    auVar16 = local_a00;
    auVar222 = vfmsub231ps_fma(auVar25,local_a00,local_560);
    auVar10 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar222._12_4_ * auVar222._12_4_,
                                                 CONCAT48(auVar222._8_4_ * auVar222._8_4_,
                                                          CONCAT44(auVar222._4_4_ * auVar222._4_4_,
                                                                   auVar222._0_4_ * auVar222._0_4_))
                                                )),ZEXT1632(auVar10),ZEXT1632(auVar10));
    auVar17 = local_680;
    auVar235._0_4_ = fVar245 * local_680._0_4_;
    auVar235._4_4_ = fVar246 * local_680._4_4_;
    auVar235._8_4_ = fVar254 * local_680._8_4_;
    auVar235._12_4_ = fVar263 * local_680._12_4_;
    auVar235._16_4_ = fVar264 * local_680._16_4_;
    auVar235._20_4_ = fVar265 * local_680._20_4_;
    auVar235._24_4_ = fVar266 * local_680._24_4_;
    auVar235._28_4_ = 0;
    auVar15 = local_a20;
    auVar222 = vfmsub231ps_fma(auVar235,local_a20,local_600);
    auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),ZEXT1632(auVar222),ZEXT1632(auVar222));
    auVar110 = vmaxps_avx(ZEXT1632(CONCAT412(auVar250._12_4_ * auVar144._12_4_,
                                             CONCAT48(auVar250._8_4_ * auVar144._8_4_,
                                                      CONCAT44(auVar250._4_4_ * auVar144._4_4_,
                                                               auVar250._0_4_ * auVar144._0_4_)))),
                          ZEXT1632(CONCAT412(auVar10._12_4_ * auVar144._12_4_,
                                             CONCAT48(auVar10._8_4_ * auVar144._8_4_,
                                                      CONCAT44(auVar10._4_4_ * auVar144._4_4_,
                                                               auVar10._0_4_ * auVar144._0_4_)))));
    local_6c0._0_4_ = auVar9._0_4_ + fVar220;
    local_6c0._4_4_ = auVar9._4_4_ + fVar227;
    local_6c0._8_4_ = auVar9._8_4_ + fVar228;
    local_6c0._12_4_ = auVar9._12_4_ + fVar229;
    local_6c0._16_4_ = fVar188 * 0.0 + 0.0;
    local_6c0._20_4_ = fVar188 * 0.0 + 0.0;
    local_6c0._24_4_ = fVar188 * 0.0 + 0.0;
    local_6c0._28_4_ = fVar126 + 0.0;
    auVar267 = vsubps_avx(auVar268,auVar20);
    _local_760 = vpermps_avx2(_DAT_01fec480,auVar267);
    _local_780 = vpermps_avx2(_DAT_01fec480,auVar268);
    auVar267 = vmaxps_avx(auVar268,local_6c0);
    auVar223 = vmaxps_avx(_local_760,_local_780);
    auVar11 = vrsqrtps_avx(ZEXT1632(auVar104));
    auVar267 = vmaxps_avx(auVar267,auVar223);
    fVar188 = auVar11._0_4_;
    fVar126 = auVar11._4_4_;
    fVar220 = auVar11._8_4_;
    fVar227 = auVar11._12_4_;
    fVar228 = auVar11._16_4_;
    fVar229 = auVar11._20_4_;
    fVar230 = auVar11._24_4_;
    auVar248._0_4_ = fVar188 * fVar188 * fVar188 * auVar104._0_4_ * -0.5;
    auVar248._4_4_ = fVar126 * fVar126 * fVar126 * auVar104._4_4_ * -0.5;
    auVar248._8_4_ = fVar220 * fVar220 * fVar220 * auVar104._8_4_ * -0.5;
    auVar248._12_4_ = fVar227 * fVar227 * fVar227 * auVar104._12_4_ * -0.5;
    auVar248._16_4_ = fVar228 * fVar228 * fVar228 * -0.0;
    auVar248._20_4_ = fVar229 * fVar229 * fVar229 * -0.0;
    auVar248._24_4_ = fVar230 * fVar230 * fVar230 * -0.0;
    auVar248._28_4_ = 0;
    auVar111._8_4_ = 0x3fc00000;
    auVar111._0_8_ = 0x3fc000003fc00000;
    auVar111._12_4_ = 0x3fc00000;
    auVar111._16_4_ = 0x3fc00000;
    auVar111._20_4_ = 0x3fc00000;
    auVar111._24_4_ = 0x3fc00000;
    auVar111._28_4_ = 0x3fc00000;
    auVar144 = vfmadd231ps_fma(auVar248,auVar111,auVar11);
    fVar126 = auVar144._0_4_;
    fVar220 = auVar144._4_4_;
    auVar26._4_4_ = fVar246 * fVar220;
    auVar26._0_4_ = fVar245 * fVar126;
    fVar228 = auVar144._8_4_;
    auVar26._8_4_ = fVar254 * fVar228;
    fVar230 = auVar144._12_4_;
    auVar26._12_4_ = fVar263 * fVar230;
    auVar26._16_4_ = fVar264 * 0.0;
    auVar26._20_4_ = fVar265 * 0.0;
    auVar26._24_4_ = fVar266 * 0.0;
    auVar26._28_4_ = 0;
    auVar27._4_4_ = fStack_6fc * fVar204 * fVar220;
    auVar27._0_4_ = local_700 * fVar231 * fVar126;
    auVar27._8_4_ = fStack_6f8 * fVar213 * fVar228;
    auVar27._12_4_ = fStack_6f4 * fVar214 * fVar230;
    auVar27._16_4_ = fStack_6f0 * fVar215 * 0.0;
    auVar27._20_4_ = fStack_6ec * fVar216 * 0.0;
    auVar27._24_4_ = fStack_6e8 * fVar217 * 0.0;
    auVar27._28_4_ = local_600._28_4_;
    auVar144 = vfmadd231ps_fma(auVar27,auVar26,_local_6e0);
    auVar223 = vsubps_avx(ZEXT832(0) << 0x20,local_520);
    fVar245 = auVar223._0_4_;
    fVar246 = auVar223._4_4_;
    auVar28._4_4_ = fVar246 * fVar204 * fVar220;
    auVar28._0_4_ = fVar245 * fVar231 * fVar126;
    fVar254 = auVar223._8_4_;
    auVar28._8_4_ = fVar254 * fVar213 * fVar228;
    fVar263 = auVar223._12_4_;
    auVar28._12_4_ = fVar263 * fVar214 * fVar230;
    fVar264 = auVar223._16_4_;
    auVar28._16_4_ = fVar264 * fVar215 * 0.0;
    fVar265 = auVar223._20_4_;
    auVar28._20_4_ = fVar265 * fVar216 * 0.0;
    fVar266 = auVar223._24_4_;
    auVar28._24_4_ = fVar266 * fVar217 * 0.0;
    auVar28._28_4_ = 0;
    auVar223 = vsubps_avx(ZEXT832(0) << 0x20,local_a40);
    auVar104 = vfmadd231ps_fma(auVar28,auVar223,auVar26);
    auVar29._4_4_ = fVar203 * fVar220;
    auVar29._0_4_ = fVar218 * fVar126;
    auVar29._8_4_ = fVar275 * fVar228;
    auVar29._12_4_ = fVar276 * fVar230;
    auVar29._16_4_ = fVar277 * 0.0;
    auVar29._20_4_ = fVar232 * 0.0;
    auVar29._24_4_ = fVar244 * 0.0;
    auVar29._28_4_ = 0;
    auVar144 = vfmadd231ps_fma(ZEXT1632(auVar144),auVar29,local_5c0);
    auVar11 = vsubps_avx(ZEXT832(0) << 0x20,local_840);
    auVar257 = ZEXT3264(auVar11);
    auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar11,auVar29);
    auVar30._4_4_ = fStack_6fc * fVar246;
    auVar30._0_4_ = local_700 * fVar245;
    auVar30._8_4_ = fStack_6f8 * fVar254;
    auVar30._12_4_ = fStack_6f4 * fVar263;
    auVar30._16_4_ = fStack_6f0 * fVar264;
    auVar30._20_4_ = fStack_6ec * fVar265;
    auVar30._24_4_ = fStack_6e8 * fVar266;
    auVar30._28_4_ = 0;
    auVar9 = vfmadd231ps_fma(auVar30,_local_6e0,auVar223);
    auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),local_5c0,auVar11);
    fVar188 = auVar104._0_4_;
    fVar215 = auVar144._0_4_;
    fVar227 = auVar104._4_4_;
    fVar216 = auVar144._4_4_;
    fVar229 = auVar104._8_4_;
    fVar217 = auVar144._8_4_;
    fVar231 = auVar104._12_4_;
    fVar218 = auVar144._12_4_;
    auVar13 = vsubps_avx(ZEXT1632(auVar9),
                         ZEXT1632(CONCAT412(fVar218 * fVar231,
                                            CONCAT48(fVar217 * fVar229,
                                                     CONCAT44(fVar216 * fVar227,fVar215 * fVar188)))
                                 ));
    auVar31._4_4_ = fVar246 * fVar246;
    auVar31._0_4_ = fVar245 * fVar245;
    auVar31._8_4_ = fVar254 * fVar254;
    auVar31._12_4_ = fVar263 * fVar263;
    auVar31._16_4_ = fVar264 * fVar264;
    auVar31._20_4_ = fVar265 * fVar265;
    auVar31._24_4_ = fVar266 * fVar266;
    auVar31._28_4_ = 0;
    auVar9 = vfmadd231ps_fma(auVar31,auVar223,auVar223);
    auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar11,auVar11);
    auVar32._28_4_ = fStack_6e4;
    auVar32._0_28_ =
         ZEXT1628(CONCAT412(fVar231 * fVar231,
                            CONCAT48(fVar229 * fVar229,CONCAT44(fVar227 * fVar227,fVar188 * fVar188)
                                    )));
    auVar239 = vsubps_avx(ZEXT1632(auVar9),auVar32);
    _local_7c0 = vsqrtps_avx(auVar110);
    fVar188 = (local_7c0._0_4_ + auVar267._0_4_) * 1.0000002;
    fVar227 = (local_7c0._4_4_ + auVar267._4_4_) * 1.0000002;
    fVar229 = (local_7c0._8_4_ + auVar267._8_4_) * 1.0000002;
    fVar231 = (local_7c0._12_4_ + auVar267._12_4_) * 1.0000002;
    fVar204 = (local_7c0._16_4_ + auVar267._16_4_) * 1.0000002;
    fVar213 = (local_7c0._20_4_ + auVar267._20_4_) * 1.0000002;
    fVar214 = (local_7c0._24_4_ + auVar267._24_4_) * 1.0000002;
    auVar33._4_4_ = fVar227 * fVar227;
    auVar33._0_4_ = fVar188 * fVar188;
    auVar33._8_4_ = fVar229 * fVar229;
    auVar33._12_4_ = fVar231 * fVar231;
    auVar33._16_4_ = fVar204 * fVar204;
    auVar33._20_4_ = fVar213 * fVar213;
    auVar33._24_4_ = fVar214 * fVar214;
    auVar33._28_4_ = local_7c0._28_4_ + auVar267._28_4_;
    local_940._0_4_ = auVar13._0_4_ + auVar13._0_4_;
    local_940._4_4_ = auVar13._4_4_ + auVar13._4_4_;
    local_940._8_4_ = auVar13._8_4_ + auVar13._8_4_;
    local_940._12_4_ = auVar13._12_4_ + auVar13._12_4_;
    local_940._16_4_ = auVar13._16_4_ + auVar13._16_4_;
    local_940._20_4_ = auVar13._20_4_ + auVar13._20_4_;
    local_940._24_4_ = auVar13._24_4_ + auVar13._24_4_;
    fVar188 = auVar13._28_4_;
    local_940._28_4_ = fVar188 + fVar188;
    auVar267 = vsubps_avx(auVar239,auVar33);
    auVar118 = ZEXT1632(auVar144);
    auVar7 = ZEXT1632(CONCAT412(fVar218 * fVar218,
                                CONCAT48(fVar217 * fVar217,
                                         CONCAT44(fVar216 * fVar216,fVar215 * fVar215))));
    auVar226 = ZEXT3264(local_220);
    local_5e0 = vsubps_avx(local_220,auVar7);
    local_7a0._4_4_ = local_940._4_4_ * local_940._4_4_;
    local_7a0._0_4_ = local_940._0_4_ * local_940._0_4_;
    local_7a0._8_4_ = local_940._8_4_ * local_940._8_4_;
    local_7a0._12_4_ = local_940._12_4_ * local_940._12_4_;
    local_7a0._16_4_ = local_940._16_4_ * local_940._16_4_;
    local_7a0._20_4_ = local_940._20_4_ * local_940._20_4_;
    local_7a0._24_4_ = local_940._24_4_ * local_940._24_4_;
    local_7a0._28_4_ = local_6e0._28_4_;
    fVar231 = local_5e0._0_4_;
    fVar227 = fVar231 * 4.0;
    fVar204 = local_5e0._4_4_;
    fVar229 = fVar204 * 4.0;
    fVar213 = local_5e0._8_4_;
    fStack_878 = fVar213 * 4.0;
    fVar214 = local_5e0._12_4_;
    fStack_874 = fVar214 * 4.0;
    fVar215 = local_5e0._16_4_;
    fStack_870 = fVar215 * 4.0;
    fVar216 = local_5e0._20_4_;
    fStack_86c = fVar216 * 4.0;
    fVar217 = local_5e0._24_4_;
    fStack_868 = fVar217 * 4.0;
    local_880 = CONCAT44(fVar229,fVar227);
    uStack_864 = 0x40800000;
    auVar34._4_4_ = auVar267._4_4_ * fVar229;
    auVar34._0_4_ = auVar267._0_4_ * fVar227;
    auVar34._8_4_ = auVar267._8_4_ * fStack_878;
    auVar34._12_4_ = auVar267._12_4_ * fStack_874;
    auVar34._16_4_ = auVar267._16_4_ * fStack_870;
    auVar34._20_4_ = auVar267._20_4_ * fStack_86c;
    auVar34._24_4_ = auVar267._24_4_ * fStack_868;
    auVar34._28_4_ = fVar188;
    auVar13 = vsubps_avx(local_7a0,auVar34);
    auVar110 = vcmpps_avx(auVar13,ZEXT432(0) << 0x20,5);
    auVar280 = ZEXT1632(auVar104);
    fVar188 = local_5e0._28_4_;
    if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar110 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar110 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar110 >> 0x7f,0) == '\0') &&
          (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar110 >> 0xbf,0) == '\0') &&
        (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar110[0x1f])
    {
      auVar184._8_4_ = 0x7f800000;
      auVar184._0_8_ = 0x7f8000007f800000;
      auVar184._12_4_ = 0x7f800000;
      auVar184._16_4_ = 0x7f800000;
      auVar184._20_4_ = 0x7f800000;
      auVar184._24_4_ = 0x7f800000;
      auVar184._28_4_ = 0x7f800000;
      auVar112._8_4_ = 0xff800000;
      auVar112._0_8_ = 0xff800000ff800000;
      auVar112._12_4_ = 0xff800000;
      auVar112._16_4_ = 0xff800000;
      auVar112._20_4_ = 0xff800000;
      auVar112._24_4_ = 0xff800000;
      auVar112._28_4_ = 0xff800000;
      auVar243 = ZEXT3264(CONCAT428(fStack_6e4,
                                    CONCAT424(fStack_6e8,
                                              CONCAT420(fStack_6ec,
                                                        CONCAT416(fStack_6f0,
                                                                  CONCAT412(fStack_6f4,
                                                                            CONCAT48(fStack_6f8,
                                                                                     CONCAT44(
                                                  fStack_6fc,local_700))))))));
    }
    else {
      local_620 = auVar239;
      auVar12 = vsqrtps_avx(auVar13);
      auVar258._0_4_ = fVar231 + fVar231;
      auVar258._4_4_ = fVar204 + fVar204;
      auVar258._8_4_ = fVar213 + fVar213;
      auVar258._12_4_ = fVar214 + fVar214;
      auVar258._16_4_ = fVar215 + fVar215;
      auVar258._20_4_ = fVar216 + fVar216;
      auVar258._24_4_ = fVar217 + fVar217;
      auVar258._28_4_ = fVar188 + fVar188;
      auVar200 = vrcpps_avx(auVar258);
      auVar8 = vcmpps_avx(auVar13,ZEXT432(0) << 0x20,5);
      auVar113._8_4_ = 0x3f800000;
      auVar113._0_8_ = 0x3f8000003f800000;
      auVar113._12_4_ = 0x3f800000;
      auVar113._16_4_ = 0x3f800000;
      auVar113._20_4_ = 0x3f800000;
      auVar113._24_4_ = 0x3f800000;
      auVar113._28_4_ = 0x3f800000;
      auVar144 = vfnmadd213ps_fma(auVar258,auVar200,auVar113);
      auVar144 = vfmadd132ps_fma(ZEXT1632(auVar144),auVar200,auVar200);
      auVar185._0_4_ = (uint)local_940._0_4_ ^ local_720;
      auVar185._4_4_ = (uint)local_940._4_4_ ^ uStack_71c;
      auVar185._8_4_ = (uint)local_940._8_4_ ^ uStack_718;
      auVar185._12_4_ = (uint)local_940._12_4_ ^ uStack_714;
      auVar185._16_4_ = (uint)local_940._16_4_ ^ (uint)fStack_710;
      auVar185._20_4_ = (uint)local_940._20_4_ ^ (uint)fStack_70c;
      auVar185._24_4_ = (uint)local_940._24_4_ ^ (uint)fStack_708;
      auVar185._28_4_ = (uint)local_940._28_4_ ^ uStack_704;
      auVar13 = vsubps_avx(auVar185,auVar12);
      auVar35._4_4_ = auVar144._4_4_ * auVar13._4_4_;
      auVar35._0_4_ = auVar144._0_4_ * auVar13._0_4_;
      auVar35._8_4_ = auVar144._8_4_ * auVar13._8_4_;
      auVar35._12_4_ = auVar144._12_4_ * auVar13._12_4_;
      auVar35._16_4_ = auVar13._16_4_ * 0.0;
      auVar35._20_4_ = auVar13._20_4_ * 0.0;
      auVar35._24_4_ = auVar13._24_4_ * 0.0;
      auVar35._28_4_ = auVar13._28_4_;
      auVar13 = vsubps_avx(auVar12,local_940);
      auVar36._4_4_ = auVar144._4_4_ * auVar13._4_4_;
      auVar36._0_4_ = auVar144._0_4_ * auVar13._0_4_;
      auVar36._8_4_ = auVar144._8_4_ * auVar13._8_4_;
      auVar36._12_4_ = auVar144._12_4_ * auVar13._12_4_;
      auVar36._16_4_ = auVar13._16_4_ * 0.0;
      auVar36._20_4_ = auVar13._20_4_ * 0.0;
      auVar36._24_4_ = auVar13._24_4_ * 0.0;
      auVar36._28_4_ = auVar13._28_4_;
      auVar144 = vfmadd213ps_fma(auVar118,auVar35,auVar280);
      _local_580 = ZEXT1628(CONCAT412(fVar230 * auVar144._12_4_,
                                      CONCAT48(fVar228 * auVar144._8_4_,
                                               CONCAT44(fVar220 * auVar144._4_4_,
                                                        fVar126 * auVar144._0_4_))));
      uStack_564 = 0x3f800000;
      auVar55._4_4_ = uStack_73c;
      auVar55._0_4_ = local_740;
      auVar55._8_4_ = uStack_738;
      auVar55._12_4_ = uStack_734;
      auVar55._16_4_ = uStack_730;
      auVar55._20_4_ = uStack_72c;
      auVar55._24_4_ = uStack_728;
      auVar55._28_4_ = uStack_724;
      _local_7e0 = auVar7;
      auVar13 = vandps_avx(auVar55,auVar7);
      auVar13 = vmaxps_avx(local_440,auVar13);
      auVar37._4_4_ = auVar13._4_4_ * 1.9073486e-06;
      auVar37._0_4_ = auVar13._0_4_ * 1.9073486e-06;
      auVar37._8_4_ = auVar13._8_4_ * 1.9073486e-06;
      auVar37._12_4_ = auVar13._12_4_ * 1.9073486e-06;
      auVar37._16_4_ = auVar13._16_4_ * 1.9073486e-06;
      auVar37._20_4_ = auVar13._20_4_ * 1.9073486e-06;
      auVar37._24_4_ = auVar13._24_4_ * 1.9073486e-06;
      auVar37._28_4_ = auVar13._28_4_;
      auVar13 = vandps_avx(local_5e0,auVar55);
      auVar13 = vcmpps_avx(auVar13,auVar37,1);
      auVar226 = ZEXT3264(auVar13);
      auVar144 = vfmadd213ps_fma(auVar118,auVar36,auVar280);
      auVar114._8_4_ = 0x7f800000;
      auVar114._0_8_ = 0x7f8000007f800000;
      auVar114._12_4_ = 0x7f800000;
      auVar114._16_4_ = 0x7f800000;
      auVar114._20_4_ = 0x7f800000;
      auVar114._24_4_ = 0x7f800000;
      auVar114._28_4_ = 0x7f800000;
      auVar184 = vblendvps_avx(auVar114,auVar35,auVar8);
      local_5a0 = fVar126 * auVar144._0_4_;
      fStack_59c = fVar220 * auVar144._4_4_;
      fStack_598 = fVar228 * auVar144._8_4_;
      fStack_594 = fVar230 * auVar144._12_4_;
      fStack_590 = 0.0;
      fStack_58c = 0.0;
      fStack_588 = 0.0;
      fStack_584 = INFINITY;
      auVar115._8_4_ = 0xff800000;
      auVar115._0_8_ = 0xff800000ff800000;
      auVar115._12_4_ = 0xff800000;
      auVar115._16_4_ = 0xff800000;
      auVar115._20_4_ = 0xff800000;
      auVar115._24_4_ = 0xff800000;
      auVar115._28_4_ = 0xff800000;
      auVar112 = vblendvps_avx(auVar115,auVar36,auVar8);
      auVar200 = auVar8 & auVar13;
      if ((((((((auVar200 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar200 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar200 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar200 >> 0x7f,0) == '\0') &&
            (auVar200 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar200 >> 0xbf,0) == '\0') &&
          (auVar200 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar200[0x1f]) {
        auVar243 = ZEXT3264(CONCAT428(fStack_6e4,
                                      CONCAT424(fStack_6e8,
                                                CONCAT420(fStack_6ec,
                                                          CONCAT416(fStack_6f0,
                                                                    CONCAT412(fStack_6f4,
                                                                              CONCAT48(fStack_6f8,
                                                                                       CONCAT44(
                                                  fStack_6fc,local_700))))))));
      }
      else {
        auVar110 = vandps_avx(auVar13,auVar8);
        auVar13 = vcmpps_avx(auVar267,ZEXT832(0) << 0x20,2);
        auVar166._8_4_ = 0xff800000;
        auVar166._0_8_ = 0xff800000ff800000;
        auVar166._12_4_ = 0xff800000;
        auVar166._16_4_ = 0xff800000;
        auVar166._20_4_ = 0xff800000;
        auVar166._24_4_ = 0xff800000;
        auVar166._28_4_ = 0xff800000;
        auVar125._8_4_ = 0x7f800000;
        auVar125._0_8_ = 0x7f8000007f800000;
        auVar125._12_4_ = 0x7f800000;
        auVar125._16_4_ = 0x7f800000;
        auVar125._20_4_ = 0x7f800000;
        auVar125._24_4_ = 0x7f800000;
        auVar125._28_4_ = 0x7f800000;
        auVar267 = vblendvps_avx(auVar125,auVar166,auVar13);
        auVar144 = vpackssdw_avx(auVar110._0_16_,auVar110._16_16_);
        auVar200 = vpmovsxwd_avx2(auVar144);
        auVar226 = ZEXT3264(auVar200);
        auVar184 = vblendvps_avx(auVar184,auVar267,auVar200);
        auVar267 = vblendvps_avx(auVar166,auVar125,auVar13);
        auVar112 = vblendvps_avx(auVar112,auVar267,auVar200);
        auVar202._0_8_ = auVar110._0_8_ ^ 0xffffffffffffffff;
        auVar202._8_4_ = auVar110._8_4_ ^ 0xffffffff;
        auVar202._12_4_ = auVar110._12_4_ ^ 0xffffffff;
        auVar202._16_4_ = auVar110._16_4_ ^ 0xffffffff;
        auVar202._20_4_ = auVar110._20_4_ ^ 0xffffffff;
        auVar202._24_4_ = auVar110._24_4_ ^ 0xffffffff;
        auVar202._28_4_ = auVar110._28_4_ ^ 0xffffffff;
        auVar110 = vorps_avx(auVar13,auVar202);
        auVar110 = vandps_avx(auVar8,auVar110);
        auVar243 = ZEXT3264(CONCAT428(fStack_6e4,
                                      CONCAT424(fStack_6e8,
                                                CONCAT420(fStack_6ec,
                                                          CONCAT416(fStack_6f0,
                                                                    CONCAT412(fStack_6f4,
                                                                              CONCAT48(fStack_6f8,
                                                                                       CONCAT44(
                                                  fStack_6fc,local_700))))))));
      }
    }
    auVar273 = ZEXT3264(_local_6e0);
    auVar262 = ZEXT3264(local_420);
    auVar267 = local_420 & auVar110;
    local_880 = uVar85;
    if ((((((((auVar267 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar267 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar267 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar267 >> 0x7f,0) != '\0') ||
          (auVar267 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar267 >> 0xbf,0) != '\0') ||
        (auVar267 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar267[0x1f] < '\0') {
      fVar218 = (ray->super_RayK<1>).org.field_0.m128[3] - (float)local_7f0._0_4_;
      auVar198._4_4_ = fVar218;
      auVar198._0_4_ = fVar218;
      auVar198._8_4_ = fVar218;
      auVar198._12_4_ = fVar218;
      auVar198._16_4_ = fVar218;
      auVar198._20_4_ = fVar218;
      auVar198._24_4_ = fVar218;
      auVar198._28_4_ = fVar218;
      auVar13 = vmaxps_avx(auVar198,auVar184);
      fVar218 = (ray->super_RayK<1>).tfar - (float)local_7f0._0_4_;
      auVar199._4_4_ = fVar218;
      auVar199._0_4_ = fVar218;
      auVar199._8_4_ = fVar218;
      auVar199._12_4_ = fVar218;
      auVar199._16_4_ = fVar218;
      auVar199._20_4_ = fVar218;
      auVar199._24_4_ = fVar218;
      auVar199._28_4_ = fVar218;
      auVar8 = vminps_avx(auVar199,auVar112);
      auVar273._0_4_ = fVar245 * fVar281;
      auVar273._4_4_ = fVar246 * fVar282;
      auVar273._8_4_ = fVar254 * fVar283;
      auVar273._12_4_ = fVar263 * fVar284;
      auVar273._16_4_ = fVar264 * fVar285;
      auVar273._20_4_ = fVar265 * fVar286;
      auVar273._28_36_ = auVar226._28_36_;
      auVar273._24_4_ = fVar266 * fVar287;
      auVar144 = vfmadd213ps_fma(auVar223,local_9c0,auVar273._0_32_);
      auVar104 = vfmadd213ps_fma(auVar11,local_920,ZEXT1632(auVar144));
      auVar38._4_4_ = auVar243._4_4_ * fVar282;
      auVar38._0_4_ = auVar243._0_4_ * fVar281;
      auVar38._8_4_ = auVar243._8_4_ * fVar283;
      auVar38._12_4_ = auVar243._12_4_ * fVar284;
      auVar38._16_4_ = auVar243._16_4_ * fVar285;
      auVar38._20_4_ = auVar243._20_4_ * fVar286;
      auVar38._24_4_ = auVar243._24_4_ * fVar287;
      auVar38._28_4_ = auVar226._28_4_;
      auVar144 = vfmadd231ps_fma(auVar38,_local_6e0,local_9c0);
      auVar9 = vfmadd231ps_fma(ZEXT1632(auVar144),local_920,local_5c0);
      auVar56._4_4_ = uStack_73c;
      auVar56._0_4_ = local_740;
      auVar56._8_4_ = uStack_738;
      auVar56._12_4_ = uStack_734;
      auVar56._16_4_ = uStack_730;
      auVar56._20_4_ = uStack_72c;
      auVar56._24_4_ = uStack_728;
      auVar56._28_4_ = uStack_724;
      auVar267 = vandps_avx(auVar56,ZEXT1632(auVar9));
      auVar116._8_4_ = 0x219392ef;
      auVar116._0_8_ = 0x219392ef219392ef;
      auVar116._12_4_ = 0x219392ef;
      auVar116._16_4_ = 0x219392ef;
      auVar116._20_4_ = 0x219392ef;
      auVar116._24_4_ = 0x219392ef;
      auVar116._28_4_ = 0x219392ef;
      auVar223 = vcmpps_avx(auVar267,auVar116,1);
      auVar267 = vrcpps_avx(ZEXT1632(auVar9));
      auVar269._8_4_ = 0x3f800000;
      auVar269._0_8_ = 0x3f8000003f800000;
      auVar269._12_4_ = 0x3f800000;
      auVar269._16_4_ = 0x3f800000;
      auVar269._20_4_ = 0x3f800000;
      auVar269._24_4_ = 0x3f800000;
      auVar269._28_4_ = 0x3f800000;
      auVar200 = ZEXT1632(auVar9);
      auVar144 = vfnmadd213ps_fma(auVar267,auVar200,auVar269);
      auVar144 = vfmadd132ps_fma(ZEXT1632(auVar144),auVar267,auVar267);
      auVar270._0_4_ = auVar9._0_4_ ^ local_720;
      auVar270._4_4_ = auVar9._4_4_ ^ uStack_71c;
      auVar270._8_4_ = auVar9._8_4_ ^ uStack_718;
      auVar270._12_4_ = auVar9._12_4_ ^ uStack_714;
      auVar270._16_4_ = fStack_710;
      auVar270._20_4_ = fStack_70c;
      auVar270._24_4_ = fStack_708;
      auVar270._28_4_ = uStack_704;
      auVar39._4_4_ = auVar144._4_4_ * (float)(auVar104._4_4_ ^ uStack_71c);
      auVar39._0_4_ = auVar144._0_4_ * (float)(auVar104._0_4_ ^ local_720);
      auVar39._8_4_ = auVar144._8_4_ * (float)(auVar104._8_4_ ^ uStack_718);
      auVar39._12_4_ = auVar144._12_4_ * (float)(auVar104._12_4_ ^ uStack_714);
      auVar39._16_4_ = fStack_710 * 0.0;
      auVar39._20_4_ = fStack_70c * 0.0;
      auVar39._24_4_ = fStack_708 * 0.0;
      auVar39._28_4_ = uStack_704;
      auVar267 = vcmpps_avx(auVar200,auVar270,1);
      auVar267 = vorps_avx(auVar223,auVar267);
      auVar259._8_4_ = 0xff800000;
      auVar259._0_8_ = 0xff800000ff800000;
      auVar259._12_4_ = 0xff800000;
      auVar259._16_4_ = 0xff800000;
      auVar259._20_4_ = 0xff800000;
      auVar259._24_4_ = 0xff800000;
      auVar259._28_4_ = 0xff800000;
      auVar267 = vblendvps_avx(auVar39,auVar259,auVar267);
      auVar11 = vmaxps_avx(auVar13,auVar267);
      auVar267 = vcmpps_avx(auVar200,auVar270,6);
      auVar267 = vorps_avx(auVar223,auVar267);
      auVar271._8_4_ = 0x7f800000;
      auVar271._0_8_ = 0x7f8000007f800000;
      auVar271._12_4_ = 0x7f800000;
      auVar271._16_4_ = 0x7f800000;
      auVar271._20_4_ = 0x7f800000;
      auVar271._24_4_ = 0x7f800000;
      auVar271._28_4_ = 0x7f800000;
      auVar273 = ZEXT3264(auVar271);
      auVar267 = vblendvps_avx(auVar39,auVar271,auVar267);
      auVar13 = vminps_avx(auVar8,auVar267);
      fVar218 = (float)(local_720 ^ (uint)local_680._0_4_);
      fVar203 = (float)(uStack_71c ^ (uint)local_680._4_4_);
      fVar275 = (float)(uStack_718 ^ (uint)local_680._8_4_);
      fVar276 = (float)(uStack_714 ^ (uint)local_680._12_4_);
      fVar277 = (float)((uint)fStack_710 ^ (uint)local_680._16_4_);
      fVar232 = (float)((uint)fStack_70c ^ (uint)local_680._20_4_);
      fVar244 = (float)((uint)fStack_708 ^ (uint)local_680._24_4_);
      auVar224._0_4_ = local_720 ^ (uint)local_a20._0_4_;
      auVar224._4_4_ = uStack_71c ^ (uint)local_a20._4_4_;
      auVar224._8_4_ = uStack_718 ^ (uint)local_a20._8_4_;
      auVar224._12_4_ = uStack_714 ^ (uint)local_a20._12_4_;
      auVar224._16_4_ = (uint)fStack_710 ^ (uint)local_a20._16_4_;
      auVar224._20_4_ = (uint)fStack_70c ^ (uint)local_a20._20_4_;
      auVar224._24_4_ = (uint)fStack_708 ^ (uint)local_a20._24_4_;
      auVar224._28_4_ = uStack_704 ^ local_a20._28_4_;
      auVar267 = vsubps_avx(ZEXT832(0) << 0x20,local_900);
      auVar223 = vsubps_avx(ZEXT832(0) << 0x20,local_660);
      auVar40._4_4_ = auVar223._4_4_ * fVar203;
      auVar40._0_4_ = auVar223._0_4_ * fVar218;
      auVar40._8_4_ = auVar223._8_4_ * fVar275;
      auVar40._12_4_ = auVar223._12_4_ * fVar276;
      auVar40._16_4_ = auVar223._16_4_ * fVar277;
      auVar40._20_4_ = auVar223._20_4_ * fVar232;
      auVar40._24_4_ = auVar223._24_4_ * fVar244;
      auVar40._28_4_ = auVar223._28_4_;
      auVar144 = vfmadd231ps_fma(auVar40,auVar224,auVar267);
      auVar236._0_4_ = local_720 ^ (uint)local_a00._0_4_;
      auVar236._4_4_ = uStack_71c ^ (uint)local_a00._4_4_;
      auVar236._8_4_ = uStack_718 ^ (uint)local_a00._8_4_;
      auVar236._12_4_ = uStack_714 ^ (uint)local_a00._12_4_;
      auVar236._16_4_ = (uint)fStack_710 ^ (uint)local_a00._16_4_;
      auVar236._20_4_ = (uint)fStack_70c ^ (uint)local_a00._20_4_;
      auVar236._24_4_ = (uint)fStack_708 ^ (uint)local_a00._24_4_;
      auVar236._28_4_ = uStack_704 ^ local_a00._28_4_;
      auVar267 = vsubps_avx(ZEXT832(0) << 0x20,local_8e0);
      auVar104 = vfmadd231ps_fma(ZEXT1632(auVar144),auVar236,auVar267);
      auVar41._4_4_ = fVar203 * fStack_6fc;
      auVar41._0_4_ = fVar218 * local_700;
      auVar41._8_4_ = fVar275 * fStack_6f8;
      auVar41._12_4_ = fVar276 * fStack_6f4;
      auVar41._16_4_ = fVar277 * fStack_6f0;
      auVar41._20_4_ = fVar232 * fStack_6ec;
      auVar41._24_4_ = fVar244 * fStack_6e8;
      auVar41._28_4_ = uStack_704 ^ local_680._28_4_;
      auVar144 = vfmadd231ps_fma(auVar41,auVar224,_local_6e0);
      auVar9 = vfmadd231ps_fma(ZEXT1632(auVar144),auVar236,local_5c0);
      auVar267 = vandps_avx(auVar56,ZEXT1632(auVar9));
      auVar8 = vrcpps_avx(ZEXT1632(auVar9));
      auVar156._8_4_ = 0x219392ef;
      auVar156._0_8_ = 0x219392ef219392ef;
      auVar156._12_4_ = 0x219392ef;
      auVar156._16_4_ = 0x219392ef;
      auVar156._20_4_ = 0x219392ef;
      auVar156._24_4_ = 0x219392ef;
      auVar156._28_4_ = 0x219392ef;
      auVar223 = vcmpps_avx(auVar267,auVar156,1);
      auVar226 = ZEXT3264(auVar223);
      auVar157._8_4_ = 0x3f800000;
      auVar157._0_8_ = 0x3f8000003f800000;
      auVar157._12_4_ = 0x3f800000;
      auVar157._16_4_ = 0x3f800000;
      auVar157._20_4_ = 0x3f800000;
      auVar157._24_4_ = 0x3f800000;
      auVar157._28_4_ = 0x3f800000;
      auVar200 = ZEXT1632(auVar9);
      auVar144 = vfnmadd213ps_fma(auVar8,auVar200,auVar157);
      auVar144 = vfmadd132ps_fma(ZEXT1632(auVar144),auVar8,auVar8);
      auVar237._0_4_ = auVar9._0_4_ ^ local_720;
      auVar237._4_4_ = auVar9._4_4_ ^ uStack_71c;
      auVar237._8_4_ = auVar9._8_4_ ^ uStack_718;
      auVar237._12_4_ = auVar9._12_4_ ^ uStack_714;
      auVar237._16_4_ = fStack_710;
      auVar237._20_4_ = fStack_70c;
      auVar237._24_4_ = fStack_708;
      auVar237._28_4_ = uStack_704;
      auVar243 = ZEXT3264(auVar237);
      auVar42._4_4_ = auVar144._4_4_ * (float)(auVar104._4_4_ ^ uStack_71c);
      auVar42._0_4_ = auVar144._0_4_ * (float)(auVar104._0_4_ ^ local_720);
      auVar42._8_4_ = auVar144._8_4_ * (float)(auVar104._8_4_ ^ uStack_718);
      auVar42._12_4_ = auVar144._12_4_ * (float)(auVar104._12_4_ ^ uStack_714);
      auVar42._16_4_ = fStack_710 * 0.0;
      auVar42._20_4_ = fStack_70c * 0.0;
      auVar42._24_4_ = fStack_708 * 0.0;
      auVar42._28_4_ = uStack_704;
      auVar257 = ZEXT3264(auVar42);
      auVar267 = vcmpps_avx(auVar200,auVar237,1);
      auVar267 = vorps_avx(auVar267,auVar223);
      auVar117._8_4_ = 0xff800000;
      auVar117._0_8_ = 0xff800000ff800000;
      auVar117._12_4_ = 0xff800000;
      auVar117._16_4_ = 0xff800000;
      auVar117._20_4_ = 0xff800000;
      auVar117._24_4_ = 0xff800000;
      auVar117._28_4_ = 0xff800000;
      auVar267 = vblendvps_avx(auVar42,auVar117,auVar267);
      _local_7e0 = vmaxps_avx(auVar11,auVar267);
      auVar262 = ZEXT3264(local_420);
      auVar267 = vcmpps_avx(auVar200,auVar237,6);
      auVar267 = vorps_avx(auVar223,auVar267);
      auVar267 = vblendvps_avx(auVar42,auVar271,auVar267);
      auVar110 = vandps_avx(local_420,auVar110);
      local_4a0 = vminps_avx(auVar13,auVar267);
      auVar267 = vcmpps_avx(_local_7e0,local_4a0,2);
      auVar223 = auVar110 & auVar267;
      if ((((((((auVar223 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar223 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar223 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar223 >> 0x7f,0) != '\0') ||
            (auVar223 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar223 >> 0xbf,0) != '\0') ||
          (auVar223 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar223[0x1f] < '\0') {
        auVar13 = _local_7e0;
        auVar158._8_4_ = 0x3f800000;
        auVar158._0_8_ = 0x3f8000003f800000;
        auVar158._12_4_ = 0x3f800000;
        auVar158._16_4_ = 0x3f800000;
        auVar158._20_4_ = 0x3f800000;
        auVar158._24_4_ = 0x3f800000;
        auVar158._28_4_ = 0x3f800000;
        auVar223 = vminps_avx(_local_580,auVar158);
        auVar54 = ZEXT812(0);
        auVar273 = ZEXT1264(auVar54) << 0x20;
        auVar223 = vmaxps_avx(auVar223,ZEXT1232(auVar54) << 0x20);
        auVar60._4_4_ = fStack_59c;
        auVar60._0_4_ = local_5a0;
        auVar60._8_4_ = fStack_598;
        auVar60._12_4_ = fStack_594;
        auVar60._16_4_ = fStack_590;
        auVar60._20_4_ = fStack_58c;
        auVar60._24_4_ = fStack_588;
        auVar60._28_4_ = fStack_584;
        auVar11 = vminps_avx(auVar60,auVar158);
        auVar11 = vmaxps_avx(auVar11,ZEXT1232(auVar54) << 0x20);
        auVar43._4_4_ = (auVar223._4_4_ + 1.0) * 0.125;
        auVar43._0_4_ = (auVar223._0_4_ + 0.0) * 0.125;
        auVar43._8_4_ = (auVar223._8_4_ + 2.0) * 0.125;
        auVar43._12_4_ = (auVar223._12_4_ + 3.0) * 0.125;
        auVar43._16_4_ = (auVar223._16_4_ + 4.0) * 0.125;
        auVar43._20_4_ = (auVar223._20_4_ + 5.0) * 0.125;
        auVar43._24_4_ = (auVar223._24_4_ + 6.0) * 0.125;
        auVar43._28_4_ = auVar223._28_4_ + 7.0;
        auVar144 = vfmadd213ps_fma(auVar43,local_6a0,local_860);
        auVar44._4_4_ = (auVar11._4_4_ + 1.0) * 0.125;
        auVar44._0_4_ = (auVar11._0_4_ + 0.0) * 0.125;
        auVar44._8_4_ = (auVar11._8_4_ + 2.0) * 0.125;
        auVar44._12_4_ = (auVar11._12_4_ + 3.0) * 0.125;
        auVar44._16_4_ = (auVar11._16_4_ + 4.0) * 0.125;
        auVar44._20_4_ = (auVar11._20_4_ + 5.0) * 0.125;
        auVar44._24_4_ = (auVar11._24_4_ + 6.0) * 0.125;
        auVar44._28_4_ = auVar11._28_4_ + 7.0;
        auVar104 = vfmadd213ps_fma(auVar44,local_6a0,local_860);
        auVar223 = vminps_avx(auVar268,local_6c0);
        auVar11 = vminps_avx(_local_760,_local_780);
        auVar223 = vminps_avx(auVar223,auVar11);
        auVar223 = vsubps_avx(auVar223,_local_7c0);
        auVar110 = vandps_avx(auVar267,auVar110);
        local_1a0 = ZEXT1632(auVar144);
        local_1c0 = ZEXT1632(auVar104);
        auVar45._4_4_ = auVar223._4_4_ * 0.99999976;
        auVar45._0_4_ = auVar223._0_4_ * 0.99999976;
        auVar45._8_4_ = auVar223._8_4_ * 0.99999976;
        auVar45._12_4_ = auVar223._12_4_ * 0.99999976;
        auVar45._16_4_ = auVar223._16_4_ * 0.99999976;
        auVar45._20_4_ = auVar223._20_4_ * 0.99999976;
        auVar45._24_4_ = auVar223._24_4_ * 0.99999976;
        auVar45._28_4_ = auVar223._28_4_;
        auVar267 = vmaxps_avx(ZEXT832(0) << 0x20,auVar45);
        auVar46._4_4_ = auVar267._4_4_ * auVar267._4_4_;
        auVar46._0_4_ = auVar267._0_4_ * auVar267._0_4_;
        auVar46._8_4_ = auVar267._8_4_ * auVar267._8_4_;
        auVar46._12_4_ = auVar267._12_4_ * auVar267._12_4_;
        auVar46._16_4_ = auVar267._16_4_ * auVar267._16_4_;
        auVar46._20_4_ = auVar267._20_4_ * auVar267._20_4_;
        auVar46._24_4_ = auVar267._24_4_ * auVar267._24_4_;
        auVar46._28_4_ = auVar267._28_4_;
        auVar223 = vsubps_avx(auVar239,auVar46);
        auVar47._4_4_ = auVar223._4_4_ * fVar229;
        auVar47._0_4_ = auVar223._0_4_ * fVar227;
        auVar47._8_4_ = auVar223._8_4_ * fStack_878;
        auVar47._12_4_ = auVar223._12_4_ * fStack_874;
        auVar47._16_4_ = auVar223._16_4_ * fStack_870;
        auVar47._20_4_ = auVar223._20_4_ * fStack_86c;
        auVar47._24_4_ = auVar223._24_4_ * fStack_868;
        auVar47._28_4_ = auVar267._28_4_;
        auVar11 = vsubps_avx(local_7a0,auVar47);
        auVar267 = vcmpps_avx(auVar11,ZEXT1232(auVar54) << 0x20,5);
        if ((((((((auVar267 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar267 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar267 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar267 >> 0x7f,0) == '\0') &&
              (auVar267 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar267 >> 0xbf,0) == '\0') &&
            (auVar267 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar267[0x1f]) {
          auVar118 = SUB6432(ZEXT864(0),0) << 0x20;
          _local_780 = ZEXT832(0) << 0x20;
          local_7a0 = ZEXT832(0) << 0x20;
          _local_7c0 = ZEXT832(0) << 0x20;
          auVar280 = ZEXT1632(ZEXT816(0) << 0x40);
          auVar167 = ZEXT864(0) << 0x20;
          auVar225._8_4_ = 0x7f800000;
          auVar225._0_8_ = 0x7f8000007f800000;
          auVar225._12_4_ = 0x7f800000;
          auVar225._16_4_ = 0x7f800000;
          auVar225._20_4_ = 0x7f800000;
          auVar225._24_4_ = 0x7f800000;
          auVar225._28_4_ = 0x7f800000;
          auVar243 = ZEXT3264(CONCAT428(0xff800000,
                                        CONCAT424(0xff800000,
                                                  CONCAT420(0xff800000,
                                                            CONCAT416(0xff800000,
                                                                      CONCAT412(0xff800000,
                                                                                CONCAT48(0xff800000,
                                                                                                                                                                                  
                                                  0xff800000ff800000)))))));
        }
        else {
          local_8e0 = auVar267;
          auVar8 = vsqrtps_avx(auVar11);
          auVar238._0_4_ = fVar231 + fVar231;
          auVar238._4_4_ = fVar204 + fVar204;
          auVar238._8_4_ = fVar213 + fVar213;
          auVar238._12_4_ = fVar214 + fVar214;
          auVar238._16_4_ = fVar215 + fVar215;
          auVar238._20_4_ = fVar216 + fVar216;
          auVar238._24_4_ = fVar217 + fVar217;
          auVar238._28_4_ = fVar188 + fVar188;
          auVar239 = vrcpps_avx(auVar238);
          auVar119._8_4_ = 0x3f800000;
          auVar119._0_8_ = 0x3f8000003f800000;
          auVar119._12_4_ = 0x3f800000;
          auVar119._16_4_ = 0x3f800000;
          auVar119._20_4_ = 0x3f800000;
          auVar119._24_4_ = 0x3f800000;
          auVar119._28_4_ = 0x3f800000;
          auVar144 = vfnmadd213ps_fma(auVar238,auVar239,auVar119);
          auVar144 = vfmadd132ps_fma(ZEXT1632(auVar144),auVar239,auVar239);
          auVar260._0_4_ = (uint)local_940._0_4_ ^ local_720;
          auVar260._4_4_ = (uint)local_940._4_4_ ^ uStack_71c;
          auVar260._8_4_ = (uint)local_940._8_4_ ^ uStack_718;
          auVar260._12_4_ = (uint)local_940._12_4_ ^ uStack_714;
          auVar260._16_4_ = (uint)local_940._16_4_ ^ (uint)fStack_710;
          auVar260._20_4_ = (uint)local_940._20_4_ ^ (uint)fStack_70c;
          auVar260._24_4_ = (uint)local_940._24_4_ ^ (uint)fStack_708;
          auVar260._28_4_ = (uint)local_940._28_4_ ^ uStack_704;
          auVar239 = vsubps_avx(auVar260,auVar8);
          auVar200 = vsubps_avx(auVar8,local_940);
          fVar188 = auVar239._0_4_ * auVar144._0_4_;
          fVar227 = auVar239._4_4_ * auVar144._4_4_;
          auVar48._4_4_ = fVar227;
          auVar48._0_4_ = fVar188;
          fVar229 = auVar239._8_4_ * auVar144._8_4_;
          auVar48._8_4_ = fVar229;
          fVar231 = auVar239._12_4_ * auVar144._12_4_;
          auVar48._12_4_ = fVar231;
          fVar204 = auVar239._16_4_ * 0.0;
          auVar48._16_4_ = fVar204;
          fVar213 = auVar239._20_4_ * 0.0;
          auVar48._20_4_ = fVar213;
          fVar214 = auVar239._24_4_ * 0.0;
          auVar48._24_4_ = fVar214;
          auVar48._28_4_ = auVar8._28_4_;
          fVar215 = auVar200._0_4_ * auVar144._0_4_;
          fVar216 = auVar200._4_4_ * auVar144._4_4_;
          auVar49._4_4_ = fVar216;
          auVar49._0_4_ = fVar215;
          fVar217 = auVar200._8_4_ * auVar144._8_4_;
          auVar49._8_4_ = fVar217;
          fVar218 = auVar200._12_4_ * auVar144._12_4_;
          auVar49._12_4_ = fVar218;
          fVar203 = auVar200._16_4_ * 0.0;
          auVar49._16_4_ = fVar203;
          fVar275 = auVar200._20_4_ * 0.0;
          auVar49._20_4_ = fVar275;
          fVar276 = auVar200._24_4_ * 0.0;
          auVar49._24_4_ = fVar276;
          auVar49._28_4_ = auVar239._28_4_;
          auVar262 = ZEXT3264(auVar49);
          auVar144 = vfmadd213ps_fma(auVar118,auVar48,auVar280);
          auVar104 = vfmadd213ps_fma(auVar118,auVar49,auVar280);
          auVar239 = ZEXT1632(CONCAT412(fVar230 * auVar144._12_4_,
                                        CONCAT48(fVar228 * auVar144._8_4_,
                                                 CONCAT44(fVar220 * auVar144._4_4_,
                                                          fVar126 * auVar144._0_4_))));
          auVar118 = ZEXT1632(CONCAT412(fVar230 * auVar104._12_4_,
                                        CONCAT48(fVar228 * auVar104._8_4_,
                                                 CONCAT44(fVar220 * auVar104._4_4_,
                                                          fVar126 * auVar104._0_4_))));
          auVar144 = vfmadd213ps_fma(local_540,auVar239,local_840);
          auVar104 = vfmadd213ps_fma(local_540,auVar118,local_840);
          auVar9 = vfmadd213ps_fma(local_560,auVar239,local_a40);
          auVar250 = vfmadd213ps_fma(local_560,auVar118,local_a40);
          auVar10 = vfmadd213ps_fma(auVar239,local_600,local_520);
          auVar222 = vfmadd213ps_fma(local_600,auVar118,local_520);
          auVar273 = ZEXT3264(local_5c0);
          auVar50._4_4_ = local_5c0._4_4_ * fVar227;
          auVar50._0_4_ = local_5c0._0_4_ * fVar188;
          auVar50._8_4_ = local_5c0._8_4_ * fVar229;
          auVar50._12_4_ = local_5c0._12_4_ * fVar231;
          auVar50._16_4_ = local_5c0._16_4_ * fVar204;
          auVar50._20_4_ = local_5c0._20_4_ * fVar213;
          auVar50._24_4_ = local_5c0._24_4_ * fVar214;
          auVar50._28_4_ = 0;
          auVar118 = vsubps_avx(auVar50,ZEXT1632(auVar144));
          auVar81._4_4_ = (float)local_6e0._4_4_ * fVar227;
          auVar81._0_4_ = (float)local_6e0._0_4_ * fVar188;
          auVar81._8_4_ = fStack_6d8 * fVar229;
          auVar81._12_4_ = fStack_6d4 * fVar231;
          auVar81._16_4_ = fStack_6d0 * fVar204;
          auVar81._20_4_ = fStack_6cc * fVar213;
          auVar81._24_4_ = fStack_6c8 * fVar214;
          auVar81._28_4_ = 0;
          auVar280 = vsubps_avx(auVar81,ZEXT1632(auVar9));
          auVar159._0_4_ = local_700 * fVar188;
          auVar159._4_4_ = fStack_6fc * fVar227;
          auVar159._8_4_ = fStack_6f8 * fVar229;
          auVar159._12_4_ = fStack_6f4 * fVar231;
          auVar159._16_4_ = fStack_6f0 * fVar204;
          auVar159._20_4_ = fStack_6ec * fVar213;
          auVar159._24_4_ = fStack_6e8 * fVar214;
          auVar159._28_4_ = 0;
          auVar239 = vsubps_avx(auVar159,ZEXT1632(auVar10));
          auVar167 = ZEXT3264(auVar239);
          auVar240._0_4_ = local_5c0._0_4_ * fVar215;
          auVar240._4_4_ = local_5c0._4_4_ * fVar216;
          auVar240._8_4_ = local_5c0._8_4_ * fVar217;
          auVar240._12_4_ = local_5c0._12_4_ * fVar218;
          auVar240._16_4_ = local_5c0._16_4_ * fVar203;
          auVar240._20_4_ = local_5c0._20_4_ * fVar275;
          auVar240._24_4_ = local_5c0._24_4_ * fVar276;
          auVar240._28_4_ = 0;
          _local_780 = vsubps_avx(auVar240,ZEXT1632(auVar104));
          auVar51._4_4_ = (float)local_6e0._4_4_ * fVar216;
          auVar51._0_4_ = (float)local_6e0._0_4_ * fVar215;
          auVar51._8_4_ = fStack_6d8 * fVar217;
          auVar51._12_4_ = fStack_6d4 * fVar218;
          auVar51._16_4_ = fStack_6d0 * fVar203;
          auVar51._20_4_ = fStack_6cc * fVar275;
          auVar51._24_4_ = fStack_6c8 * fVar276;
          auVar51._28_4_ = local_780._28_4_;
          local_7a0 = vsubps_avx(auVar51,ZEXT1632(auVar250));
          auVar52._4_4_ = fStack_6fc * fVar216;
          auVar52._0_4_ = local_700 * fVar215;
          auVar52._8_4_ = fStack_6f8 * fVar217;
          auVar52._12_4_ = fStack_6f4 * fVar218;
          auVar52._16_4_ = fStack_6f0 * fVar203;
          auVar52._20_4_ = fStack_6ec * fVar275;
          auVar52._24_4_ = fStack_6e8 * fVar276;
          auVar52._28_4_ = local_7a0._28_4_;
          _local_7c0 = vsubps_avx(auVar52,ZEXT1632(auVar222));
          auVar239 = vcmpps_avx(auVar11,_DAT_01faff00,5);
          auVar241._8_4_ = 0x7f800000;
          auVar241._0_8_ = 0x7f8000007f800000;
          auVar241._12_4_ = 0x7f800000;
          auVar241._16_4_ = 0x7f800000;
          auVar241._20_4_ = 0x7f800000;
          auVar241._24_4_ = 0x7f800000;
          auVar241._28_4_ = 0x7f800000;
          auVar225 = vblendvps_avx(auVar241,auVar48,auVar239);
          auVar57._4_4_ = uStack_73c;
          auVar57._0_4_ = local_740;
          auVar57._8_4_ = uStack_738;
          auVar57._12_4_ = uStack_734;
          auVar57._16_4_ = uStack_730;
          auVar57._20_4_ = uStack_72c;
          auVar57._24_4_ = uStack_728;
          auVar57._28_4_ = uStack_724;
          auVar11 = vandps_avx(auVar57,auVar7);
          auVar11 = vmaxps_avx(local_440,auVar11);
          auVar53._4_4_ = auVar11._4_4_ * 1.9073486e-06;
          auVar53._0_4_ = auVar11._0_4_ * 1.9073486e-06;
          auVar53._8_4_ = auVar11._8_4_ * 1.9073486e-06;
          auVar53._12_4_ = auVar11._12_4_ * 1.9073486e-06;
          auVar53._16_4_ = auVar11._16_4_ * 1.9073486e-06;
          auVar53._20_4_ = auVar11._20_4_ * 1.9073486e-06;
          auVar53._24_4_ = auVar11._24_4_ * 1.9073486e-06;
          auVar53._28_4_ = auVar11._28_4_;
          auVar11 = vandps_avx(auVar57,local_5e0);
          auVar7 = vcmpps_avx(auVar11,auVar53,1);
          auVar242._8_4_ = 0xff800000;
          auVar242._0_8_ = 0xff800000ff800000;
          auVar242._12_4_ = 0xff800000;
          auVar242._16_4_ = 0xff800000;
          auVar242._20_4_ = 0xff800000;
          auVar242._24_4_ = 0xff800000;
          auVar242._28_4_ = 0xff800000;
          auVar11 = vblendvps_avx(auVar242,auVar49,auVar239);
          auVar243 = ZEXT3264(auVar11);
          auVar8 = auVar239 & auVar7;
          if ((((((((auVar8 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar8 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar8 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar8 >> 0x7f,0) != '\0') ||
                (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar8 >> 0xbf,0) != '\0') ||
              (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar8[0x1f] < '\0') {
            auVar267 = vandps_avx(auVar7,auVar239);
            auVar7 = vcmpps_avx(auVar223,ZEXT832(0) << 0x20,2);
            auVar261._8_4_ = 0xff800000;
            auVar261._0_8_ = 0xff800000ff800000;
            auVar261._12_4_ = 0xff800000;
            auVar261._16_4_ = 0xff800000;
            auVar261._20_4_ = 0xff800000;
            auVar261._24_4_ = 0xff800000;
            auVar261._28_4_ = 0xff800000;
            auVar262 = ZEXT3264(auVar261);
            auVar272._8_4_ = 0x7f800000;
            auVar272._0_8_ = 0x7f8000007f800000;
            auVar272._12_4_ = 0x7f800000;
            auVar272._16_4_ = 0x7f800000;
            auVar272._20_4_ = 0x7f800000;
            auVar272._24_4_ = 0x7f800000;
            auVar272._28_4_ = 0x7f800000;
            auVar273 = ZEXT3264(auVar272);
            auVar223 = vblendvps_avx(auVar272,auVar261,auVar7);
            auVar144 = vpackssdw_avx(auVar267._0_16_,auVar267._16_16_);
            auVar8 = vpmovsxwd_avx2(auVar144);
            auVar225 = vblendvps_avx(auVar225,auVar223,auVar8);
            auVar223 = vblendvps_avx(auVar261,auVar272,auVar7);
            auVar223 = vblendvps_avx(auVar11,auVar223,auVar8);
            auVar243 = ZEXT3264(auVar223);
            auVar212._0_8_ = auVar267._0_8_ ^ 0xffffffffffffffff;
            auVar212._8_4_ = auVar267._8_4_ ^ 0xffffffff;
            auVar212._12_4_ = auVar267._12_4_ ^ 0xffffffff;
            auVar212._16_4_ = auVar267._16_4_ ^ 0xffffffff;
            auVar212._20_4_ = auVar267._20_4_ ^ 0xffffffff;
            auVar212._24_4_ = auVar267._24_4_ ^ 0xffffffff;
            auVar212._28_4_ = auVar267._28_4_ ^ 0xffffffff;
            auVar267 = vorps_avx(auVar7,auVar212);
            auVar267 = vandps_avx(auVar239,auVar267);
          }
        }
        uVar92 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
        auVar253._4_4_ = uVar92;
        auVar253._0_4_ = uVar92;
        auVar253._8_4_ = uVar92;
        auVar253._12_4_ = uVar92;
        auVar253._16_4_ = uVar92;
        auVar253._20_4_ = uVar92;
        auVar253._24_4_ = uVar92;
        auVar253._28_4_ = uVar92;
        uVar92 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
        auVar256._4_4_ = uVar92;
        auVar256._0_4_ = uVar92;
        auVar256._8_4_ = uVar92;
        auVar256._12_4_ = uVar92;
        auVar256._16_4_ = uVar92;
        auVar256._20_4_ = uVar92;
        auVar256._24_4_ = uVar92;
        auVar256._28_4_ = uVar92;
        auVar257 = ZEXT3264(auVar256);
        fVar188 = (ray->super_RayK<1>).dir.field_0.m128[2];
        local_480 = _local_7e0;
        local_460 = vminps_avx(local_4a0,auVar225);
        local_4c0 = vmaxps_avx(_local_7e0,auVar243._0_32_);
        auVar226 = ZEXT3264(local_4c0);
        auVar223 = vcmpps_avx(_local_7e0,local_460,2);
        local_5e0 = vandps_avx(auVar223,auVar110);
        auVar223 = vcmpps_avx(local_4c0,local_4a0,2);
        local_540 = vandps_avx(auVar223,auVar110);
        auVar110 = vorps_avx(local_540,local_5e0);
        if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar110 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar110 >> 0x7f,0) != '\0') ||
              (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar110 >> 0xbf,0) != '\0') ||
            (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar110[0x1f] < '\0') {
          local_600 = local_4c0;
          auVar201._0_8_ = auVar267._0_8_ ^ 0xffffffffffffffff;
          auVar201._8_4_ = auVar267._8_4_ ^ 0xffffffff;
          auVar201._12_4_ = auVar267._12_4_ ^ 0xffffffff;
          auVar201._16_4_ = auVar267._16_4_ ^ 0xffffffff;
          auVar201._20_4_ = auVar267._20_4_ ^ 0xffffffff;
          auVar201._24_4_ = auVar267._24_4_ ^ 0xffffffff;
          auVar201._28_4_ = auVar267._28_4_ ^ 0xffffffff;
          auVar168._0_4_ = fVar188 * auVar167._0_4_;
          auVar168._4_4_ = fVar188 * auVar167._4_4_;
          auVar168._8_4_ = fVar188 * auVar167._8_4_;
          auVar168._12_4_ = fVar188 * auVar167._12_4_;
          auVar168._16_4_ = fVar188 * auVar167._16_4_;
          auVar168._20_4_ = fVar188 * auVar167._20_4_;
          auVar168._28_36_ = auVar167._28_36_;
          auVar168._24_4_ = fVar188 * auVar167._24_4_;
          auVar144 = vfmadd213ps_fma(auVar280,auVar256,auVar168._0_32_);
          auVar144 = vfmadd213ps_fma(auVar118,auVar253,ZEXT1632(auVar144));
          auVar58._4_4_ = uStack_73c;
          auVar58._0_4_ = local_740;
          auVar58._8_4_ = uStack_738;
          auVar58._12_4_ = uStack_734;
          auVar58._16_4_ = uStack_730;
          auVar58._20_4_ = uStack_72c;
          auVar58._24_4_ = uStack_728;
          auVar58._28_4_ = uStack_724;
          auVar110 = vandps_avx(ZEXT1632(auVar144),auVar58);
          auVar138._8_4_ = 0x3e99999a;
          auVar138._0_8_ = 0x3e99999a3e99999a;
          auVar138._12_4_ = 0x3e99999a;
          auVar138._16_4_ = 0x3e99999a;
          auVar138._20_4_ = 0x3e99999a;
          auVar138._24_4_ = 0x3e99999a;
          auVar138._28_4_ = 0x3e99999a;
          auVar110 = vcmpps_avx(auVar110,auVar138,1);
          auVar110 = vorps_avx(auVar110,auVar201);
          auVar139._8_4_ = 3;
          auVar139._0_8_ = 0x300000003;
          auVar139._12_4_ = 3;
          auVar139._16_4_ = 3;
          auVar139._20_4_ = 3;
          auVar139._24_4_ = 3;
          auVar139._28_4_ = 3;
          auVar160._8_4_ = 2;
          auVar160._0_8_ = 0x200000002;
          auVar160._12_4_ = 2;
          auVar160._16_4_ = 2;
          auVar160._20_4_ = 2;
          auVar160._24_4_ = 2;
          auVar160._28_4_ = 2;
          auVar110 = vblendvps_avx(auVar160,auVar139,auVar110);
          local_560._4_4_ = local_acc;
          local_560._0_4_ = local_acc;
          local_560._8_4_ = local_acc;
          local_560._12_4_ = local_acc;
          local_560._16_4_ = local_acc;
          local_560._20_4_ = local_acc;
          local_560._24_4_ = local_acc;
          local_560._28_4_ = local_acc;
          local_520 = vpcmpgtd_avx2(auVar110,local_560);
          local_500 = vpandn_avx2(local_520,local_5e0);
          auVar167 = ZEXT3264(local_500);
          auVar110 = local_5e0 & ~local_520;
          local_a20 = auVar15;
          local_a00 = auVar16;
          local_680 = auVar17;
          if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar110 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar110 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar110 >> 0x7f,0) == '\0') &&
                (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar110 >> 0xbf,0) == '\0') &&
              (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar110[0x1f]) {
            fVar126 = (ray->super_RayK<1>).tfar;
            auVar120._4_4_ = fVar126;
            auVar120._0_4_ = fVar126;
            auVar120._8_4_ = fVar126;
            auVar120._12_4_ = fVar126;
            auVar120._16_4_ = fVar126;
            auVar120._20_4_ = fVar126;
            auVar120._24_4_ = fVar126;
            auVar120._28_4_ = fVar126;
            fVar126 = fVar188;
            fVar220 = fVar188;
            fVar227 = fVar188;
            fVar228 = fVar188;
            fVar229 = fVar188;
            fVar230 = fVar188;
          }
          else {
            local_280 = auVar201;
            local_5a0 = fVar188;
            fStack_59c = fVar188;
            fStack_598 = fVar188;
            fStack_594 = fVar188;
            fStack_590 = fVar188;
            fStack_58c = fVar188;
            fStack_588 = fVar188;
            fStack_584 = fVar188;
            _local_580 = auVar256;
            local_620 = auVar253;
            auVar104 = vminps_avx(local_950,local_970);
            auVar144 = vmaxps_avx(local_950,local_970);
            auVar9 = vminps_avx(local_960,_local_980);
            auVar250 = vminps_avx(auVar104,auVar9);
            auVar104 = vmaxps_avx(local_960,_local_980);
            auVar9 = vmaxps_avx(auVar144,auVar104);
            auVar144 = vandps_avx(auVar250,local_990);
            auVar104 = vandps_avx(auVar9,local_990);
            auVar144 = vmaxps_avx(auVar144,auVar104);
            auVar104 = vmovshdup_avx(auVar144);
            auVar104 = vmaxss_avx(auVar104,auVar144);
            auVar144 = vshufpd_avx(auVar144,auVar144,1);
            auVar144 = vmaxss_avx(auVar144,auVar104);
            local_8e0._0_4_ = auVar144._0_4_ * 1.9073486e-06;
            local_6c0._0_16_ = vshufps_avx(auVar9,auVar9,0xff);
            local_760._4_4_ = (float)local_7e0._4_4_ + (float)local_820._4_4_;
            local_760._0_4_ = (float)local_7e0._0_4_ + (float)local_820._0_4_;
            fStack_758 = fStack_7d8 + fStack_818;
            fStack_754 = fStack_7d4 + fStack_814;
            fStack_750 = fStack_7d0 + fStack_810;
            fStack_74c = fStack_7cc + fStack_80c;
            fStack_748 = fStack_7c8 + fStack_808;
            fStack_744 = fStack_7c4 + fStack_804;
            _local_7e0 = auVar13;
            do {
              auVar121._8_4_ = 0x7f800000;
              auVar121._0_8_ = 0x7f8000007f800000;
              auVar121._12_4_ = 0x7f800000;
              auVar121._16_4_ = 0x7f800000;
              auVar121._20_4_ = 0x7f800000;
              auVar121._24_4_ = 0x7f800000;
              auVar121._28_4_ = 0x7f800000;
              auVar110 = auVar167._0_32_;
              auVar267 = vblendvps_avx(auVar121,_local_7e0,auVar110);
              auVar223 = vshufps_avx(auVar267,auVar267,0xb1);
              auVar223 = vminps_avx(auVar267,auVar223);
              auVar11 = vshufpd_avx(auVar223,auVar223,5);
              auVar223 = vminps_avx(auVar223,auVar11);
              auVar11 = vpermpd_avx2(auVar223,0x4e);
              auVar223 = vminps_avx(auVar223,auVar11);
              auVar267 = vcmpps_avx(auVar267,auVar223,0);
              auVar223 = auVar110 & auVar267;
              if ((((((((auVar223 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar223 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar223 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar223 >> 0x7f,0) != '\0') ||
                    (auVar223 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar223 >> 0xbf,0) != '\0') ||
                  (auVar223 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar223[0x1f] < '\0') {
                auVar110 = vandps_avx(auVar267,auVar110);
              }
              uVar83 = vmovmskps_avx(auVar110);
              iVar14 = 0;
              for (; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x80000000) {
                iVar14 = iVar14 + 1;
              }
              uVar84 = iVar14 << 2;
              *(undefined4 *)(local_500 + uVar84) = 0;
              aVar1 = (ray->super_RayK<1>).dir.field_0;
              local_840._0_16_ = (undefined1  [16])aVar1;
              auVar144 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
              uVar83 = *(uint *)(local_1a0 + uVar84);
              if (auVar144._0_4_ < 0.0) {
                local_a40._0_16_ = ZEXT416(*(uint *)(local_480 + uVar84));
                fVar188 = sqrtf(auVar144._0_4_);
                auVar144 = local_a40._0_16_;
              }
              else {
                auVar144 = vsqrtss_avx(auVar144,auVar144);
                fVar188 = auVar144._0_4_;
                auVar144 = ZEXT416(*(uint *)(local_480 + uVar84));
              }
              local_680._0_4_ = fVar188 * 1.9073486e-06;
              auVar144 = vinsertps_avx(auVar144,ZEXT416(uVar83),0x10);
              lVar88 = 5;
              do {
                fVar230 = auVar144._0_4_;
                auVar99._4_4_ = fVar230;
                auVar99._0_4_ = fVar230;
                auVar99._8_4_ = fVar230;
                auVar99._12_4_ = fVar230;
                auVar9 = vfmadd213ps_fma(auVar99,local_840._0_16_,_DAT_01f7aa10);
                local_900._0_16_ = vmovshdup_avx(auVar144);
                fVar228 = local_900._0_4_;
                fVar229 = 1.0 - fVar228;
                auVar273 = ZEXT464((uint)fVar229);
                fVar188 = fVar228 * fVar228;
                auVar97 = SUB6416(ZEXT464(0x40400000),0);
                auVar222 = SUB6416(ZEXT464(0xc0a00000),0);
                auVar250 = vfmadd213ss_fma(auVar97,local_900._0_16_,auVar222);
                auVar104 = vfmadd213ss_fma(auVar250,ZEXT416((uint)fVar188),
                                           SUB6416(ZEXT464(0x40000000),0));
                local_a00._0_16_ = ZEXT416((uint)fVar229);
                auVar10 = vfmadd213ss_fma(auVar97,local_a00._0_16_,auVar222);
                auVar10 = vfmadd213ss_fma(auVar10,ZEXT416((uint)(fVar229 * fVar229)),
                                          SUB6416(ZEXT464(0x40000000),0));
                fVar126 = fVar229 * fVar229 * -fVar228 * 0.5;
                fVar220 = auVar104._0_4_ * 0.5;
                fVar227 = auVar10._0_4_ * 0.5;
                fVar228 = fVar228 * fVar228 * -fVar229 * 0.5;
                auVar170._0_4_ = fVar228 * (float)local_980._0_4_;
                auVar170._4_4_ = fVar228 * (float)local_980._4_4_;
                auVar170._8_4_ = fVar228 * fStack_978;
                auVar170._12_4_ = fVar228 * fStack_974;
                auVar191._4_4_ = fVar227;
                auVar191._0_4_ = fVar227;
                auVar191._8_4_ = fVar227;
                auVar191._12_4_ = fVar227;
                auVar104 = vfmadd132ps_fma(auVar191,auVar170,local_960);
                auVar145._4_4_ = fVar220;
                auVar145._0_4_ = fVar220;
                auVar145._8_4_ = fVar220;
                auVar145._12_4_ = fVar220;
                auVar104 = vfmadd132ps_fma(auVar145,auVar104,local_970);
                auVar171._4_4_ = fVar126;
                auVar171._0_4_ = fVar126;
                auVar171._8_4_ = fVar126;
                auVar171._12_4_ = fVar126;
                auVar104 = vfmadd132ps_fma(auVar171,auVar104,local_950);
                auVar222 = vfmadd231ss_fma(auVar222,local_900._0_16_,ZEXT416(0x41100000));
                auVar10 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),local_900._0_16_,
                                          ZEXT416(0x40800000));
                local_920._0_16_ = auVar10;
                local_660._0_16_ = auVar104;
                auVar9 = vsubps_avx(auVar9,auVar104);
                auVar104 = vdpps_avx(auVar9,auVar9,0x7f);
                auVar10 = vfmadd213ss_fma(auVar97,local_900._0_16_,ZEXT416(0xbf800000));
                local_9c0._0_16_ = auVar10;
                local_a40._0_16_ = auVar104;
                if (auVar104._0_4_ < 0.0) {
                  local_9e0._0_4_ = auVar250._0_4_;
                  local_a20._0_4_ = fVar188;
                  local_940._0_16_ = auVar222;
                  local_860._0_4_ = fVar229 * -2.0;
                  auVar262._0_4_ = sqrtf(auVar104._0_4_);
                  auVar262._4_60_ = extraout_var;
                  auVar273 = ZEXT1664(local_a00._0_16_);
                  auVar250 = ZEXT416((uint)local_9e0._0_4_);
                  auVar104 = auVar262._0_16_;
                  fVar126 = (float)local_860._0_4_;
                  fVar188 = (float)local_a20._0_4_;
                  auVar222 = local_940._0_16_;
                }
                else {
                  auVar104 = vsqrtss_avx(auVar104,auVar104);
                  fVar126 = fVar229 * -2.0;
                }
                fVar227 = auVar273._0_4_;
                fVar220 = local_900._0_4_;
                auVar10 = vfmadd213ss_fma(auVar250,ZEXT416((uint)(fVar220 + fVar220)),
                                          ZEXT416((uint)(fVar220 * fVar220 * 3.0)));
                auVar143 = SUB6416(ZEXT464(0x40000000),0);
                auVar250 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_900._0_16_,auVar143)
                ;
                auVar97 = vfmadd231ss_fma(ZEXT416((uint)(fVar227 * fVar227 * -3.0)),
                                          ZEXT416((uint)(fVar227 + fVar227)),auVar250);
                auVar128 = auVar273._0_16_;
                auVar96 = vfnmadd231ss_fma(ZEXT416((uint)(fVar220 * (fVar227 + fVar227))),auVar128,
                                           auVar128);
                auVar250 = vfmadd213ss_fma(ZEXT416((uint)fVar126),local_900._0_16_,
                                           ZEXT416((uint)fVar188));
                fVar188 = auVar97._0_4_ * 0.5;
                fVar126 = auVar250._0_4_ * 0.5;
                auVar146._0_4_ = (float)local_980._0_4_ * fVar126;
                auVar146._4_4_ = (float)local_980._4_4_ * fVar126;
                auVar146._8_4_ = fStack_978 * fVar126;
                auVar146._12_4_ = fStack_974 * fVar126;
                auVar130._4_4_ = fVar188;
                auVar130._0_4_ = fVar188;
                auVar130._8_4_ = fVar188;
                auVar130._12_4_ = fVar188;
                auVar250 = vfmadd213ps_fma(auVar130,local_960,auVar146);
                fVar188 = auVar96._0_4_ * 0.5;
                fVar126 = auVar10._0_4_ * 0.5;
                auVar147._4_4_ = fVar126;
                auVar147._0_4_ = fVar126;
                auVar147._8_4_ = fVar126;
                auVar147._12_4_ = fVar126;
                auVar250 = vfmadd213ps_fma(auVar147,local_970,auVar250);
                auVar251._4_4_ = fVar188;
                auVar251._0_4_ = fVar188;
                auVar251._8_4_ = fVar188;
                auVar251._12_4_ = fVar188;
                auVar97 = vfmadd213ps_fma(auVar251,local_950,auVar250);
                auVar96 = vfmadd213ss_fma(local_900._0_16_,SUB6416(ZEXT464(0xc0400000),0),auVar143);
                auVar100._0_4_ = (float)local_980._0_4_ * (float)local_9c0._0_4_;
                auVar100._4_4_ = (float)local_980._4_4_ * (float)local_9c0._0_4_;
                auVar100._8_4_ = fStack_978 * (float)local_9c0._0_4_;
                auVar100._12_4_ = fStack_974 * (float)local_9c0._0_4_;
                auVar131._4_4_ = local_920._0_4_;
                auVar131._0_4_ = local_920._0_4_;
                auVar131._8_4_ = local_920._0_4_;
                auVar131._12_4_ = local_920._0_4_;
                auVar250 = vfmadd213ps_fma(auVar131,local_960,auVar100);
                uVar92 = auVar222._0_4_;
                auVar148._4_4_ = uVar92;
                auVar148._0_4_ = uVar92;
                auVar148._8_4_ = uVar92;
                auVar148._12_4_ = uVar92;
                auVar250 = vfmadd213ps_fma(auVar148,local_970,auVar250);
                auVar10 = vdpps_avx(auVar97,auVar97,0x7f);
                uVar92 = auVar96._0_4_;
                auVar132._4_4_ = uVar92;
                auVar132._0_4_ = uVar92;
                auVar132._8_4_ = uVar92;
                auVar132._12_4_ = uVar92;
                auVar96 = vfmadd213ps_fma(auVar132,local_950,auVar250);
                auVar250 = vblendps_avx(auVar10,_DAT_01f7aa10,0xe);
                auVar222 = vrsqrtss_avx(auVar250,auVar250);
                fVar220 = auVar10._0_4_;
                fVar188 = auVar222._0_4_;
                auVar222 = vdpps_avx(auVar97,auVar96,0x7f);
                fVar188 = fVar188 * 1.5 + fVar220 * -0.5 * fVar188 * fVar188 * fVar188;
                auVar133._0_4_ = auVar96._0_4_ * fVar220;
                auVar133._4_4_ = auVar96._4_4_ * fVar220;
                auVar133._8_4_ = auVar96._8_4_ * fVar220;
                auVar133._12_4_ = auVar96._12_4_ * fVar220;
                fVar126 = auVar222._0_4_;
                auVar210._0_4_ = auVar97._0_4_ * fVar126;
                auVar210._4_4_ = auVar97._4_4_ * fVar126;
                fVar227 = auVar97._8_4_;
                auVar210._8_4_ = fVar227 * fVar126;
                fVar228 = auVar97._12_4_;
                auVar210._12_4_ = fVar228 * fVar126;
                auVar222 = vsubps_avx(auVar133,auVar210);
                auVar250 = vrcpss_avx(auVar250,auVar250);
                auVar96 = vfnmadd213ss_fma(auVar250,auVar10,auVar143);
                fVar126 = auVar250._0_4_ * auVar96._0_4_;
                auVar250 = vmaxss_avx(ZEXT416((uint)local_8e0._0_4_),
                                      ZEXT416((uint)(fVar230 * (float)local_680._0_4_)));
                auVar257 = ZEXT1664(auVar250);
                local_9e0._0_8_ = auVar97._0_8_ ^ 0x8000000080000000;
                local_9e0._8_4_ = -fVar227;
                local_9e0._12_4_ = -fVar228;
                auVar172._0_4_ = fVar188 * auVar222._0_4_ * fVar126;
                auVar172._4_4_ = fVar188 * auVar222._4_4_ * fVar126;
                auVar172._8_4_ = fVar188 * auVar222._8_4_ * fVar126;
                auVar172._12_4_ = fVar188 * auVar222._12_4_ * fVar126;
                local_a00._0_4_ = auVar97._0_4_ * fVar188;
                local_a00._4_4_ = auVar97._4_4_ * fVar188;
                local_a00._8_4_ = fVar227 * fVar188;
                local_a00._12_4_ = fVar228 * fVar188;
                local_900._0_16_ = auVar97;
                local_920._0_4_ = auVar250._0_4_;
                if (fVar220 < -fVar220) {
                  local_9c0._0_4_ = auVar104._0_4_;
                  local_a20._0_16_ = auVar172;
                  auVar273 = ZEXT1664(auVar128);
                  fVar188 = sqrtf(fVar220);
                  auVar257 = ZEXT464((uint)local_920._0_4_);
                  auVar104 = ZEXT416((uint)local_9c0._0_4_);
                  auVar172 = local_a20._0_16_;
                }
                else {
                  auVar250 = vsqrtss_avx(auVar10,auVar10);
                  fVar188 = auVar250._0_4_;
                }
                local_9c0._0_16_ = vdpps_avx(auVar9,local_a00._0_16_,0x7f);
                auVar226 = ZEXT1664(local_9c0._0_16_);
                auVar97 = vfmadd213ss_fma(ZEXT416((uint)local_8e0._0_4_),auVar104,auVar257._0_16_);
                auVar250 = vdpps_avx(local_9e0._0_16_,local_a00._0_16_,0x7f);
                auVar10 = vdpps_avx(auVar9,auVar172,0x7f);
                auVar222 = vdpps_avx(local_840._0_16_,local_a00._0_16_,0x7f);
                auVar97 = vfmadd213ss_fma(ZEXT416((uint)(auVar104._0_4_ + 1.0)),
                                          ZEXT416((uint)((float)local_8e0._0_4_ / fVar188)),auVar97)
                ;
                fVar188 = auVar250._0_4_ + auVar10._0_4_;
                auVar243 = ZEXT464((uint)fVar188);
                auVar101._0_4_ = local_9c0._0_4_ * local_9c0._0_4_;
                auVar101._4_4_ = local_9c0._4_4_ * local_9c0._4_4_;
                auVar101._8_4_ = local_9c0._8_4_ * local_9c0._8_4_;
                auVar101._12_4_ = local_9c0._12_4_ * local_9c0._12_4_;
                auVar104 = vdpps_avx(auVar9,local_9e0._0_16_,0x7f);
                auVar10 = vsubps_avx(local_a40._0_16_,auVar101);
                auVar250 = vrsqrtss_avx(auVar10,auVar10);
                fVar220 = auVar10._0_4_;
                fVar126 = auVar250._0_4_;
                fVar126 = fVar126 * 1.5 + fVar220 * -0.5 * fVar126 * fVar126 * fVar126;
                auVar250 = vdpps_avx(auVar9,local_840._0_16_,0x7f);
                local_9e0._0_16_ = ZEXT416((uint)fVar188);
                local_a00._0_16_ =
                     vfnmadd231ss_fma(auVar104,local_9c0._0_16_,ZEXT416((uint)fVar188));
                auVar104 = vfnmadd231ss_fma(auVar250,local_9c0._0_16_,auVar222);
                if (fVar220 < 0.0) {
                  local_a20._0_4_ = auVar97._0_4_;
                  local_940._0_16_ = auVar222;
                  local_860._0_4_ = fVar126;
                  local_6a0._0_16_ = auVar104;
                  auVar226 = ZEXT1664(local_9c0._0_16_);
                  auVar243 = ZEXT464((uint)fVar188);
                  auVar273 = ZEXT1664(auVar273._0_16_);
                  fVar188 = sqrtf(fVar220);
                  auVar257 = ZEXT464((uint)local_920._0_4_);
                  fVar126 = (float)local_860._0_4_;
                  auVar104 = local_6a0._0_16_;
                  auVar222 = local_940._0_16_;
                  fVar220 = (float)local_a20._0_4_;
                }
                else {
                  auVar250 = vsqrtss_avx(auVar10,auVar10);
                  fVar188 = auVar250._0_4_;
                  fVar220 = auVar97._0_4_;
                }
                auVar250 = vpermilps_avx(local_660._0_16_,0xff);
                fVar188 = fVar188 - auVar250._0_4_;
                auVar10 = vshufps_avx(local_900._0_16_,local_900._0_16_,0xff);
                auVar250 = vfmsub213ss_fma(local_a00._0_16_,ZEXT416((uint)fVar126),auVar10);
                auVar173._0_8_ = auVar222._0_8_ ^ 0x8000000080000000;
                auVar173._8_4_ = auVar222._8_4_ ^ 0x80000000;
                auVar173._12_4_ = auVar222._12_4_ ^ 0x80000000;
                auVar192._0_8_ = auVar250._0_8_ ^ 0x8000000080000000;
                auVar192._8_4_ = auVar250._8_4_ ^ 0x80000000;
                auVar192._12_4_ = auVar250._12_4_ ^ 0x80000000;
                auVar262 = ZEXT1664(local_9e0._0_16_);
                auVar104 = ZEXT416((uint)(auVar104._0_4_ * fVar126));
                auVar250 = vfmsub231ss_fma(ZEXT416((uint)(auVar222._0_4_ * auVar250._0_4_)),
                                           local_9e0._0_16_,auVar104);
                auVar104 = vinsertps_avx(auVar192,auVar104,0x1c);
                uVar92 = auVar250._0_4_;
                auVar193._4_4_ = uVar92;
                auVar193._0_4_ = uVar92;
                auVar193._8_4_ = uVar92;
                auVar193._12_4_ = uVar92;
                auVar104 = vdivps_avx(auVar104,auVar193);
                auVar250 = vinsertps_avx(local_9e0._0_16_,auVar173,0x10);
                auVar250 = vdivps_avx(auVar250,auVar193);
                fVar126 = local_9c0._0_4_;
                auVar149._0_4_ = fVar126 * auVar104._0_4_ + fVar188 * auVar250._0_4_;
                auVar149._4_4_ = fVar126 * auVar104._4_4_ + fVar188 * auVar250._4_4_;
                auVar149._8_4_ = fVar126 * auVar104._8_4_ + fVar188 * auVar250._8_4_;
                auVar149._12_4_ = fVar126 * auVar104._12_4_ + fVar188 * auVar250._12_4_;
                auVar144 = vsubps_avx(auVar144,auVar149);
                auVar104 = vandps_avx(local_9c0._0_16_,local_990);
                if (auVar104._0_4_ < fVar220) {
                  auVar250 = vfmadd231ss_fma(ZEXT416((uint)(auVar257._0_4_ + fVar220)),
                                             local_6c0._0_16_,ZEXT416(0x36000000));
                  auVar104 = vandps_avx(ZEXT416((uint)fVar188),local_990);
                  if (auVar104._0_4_ < auVar250._0_4_) {
                    fVar188 = auVar144._0_4_ + (float)local_7f0._0_4_;
                    if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar188) &&
                       (fVar126 = (ray->super_RayK<1>).tfar, fVar188 <= fVar126)) {
                      auVar144 = vmovshdup_avx(auVar144);
                      fVar220 = auVar144._0_4_;
                      if ((0.0 <= fVar220) && (fVar220 <= 1.0)) {
                        auVar144 = vrsqrtss_avx(local_a40._0_16_,local_a40._0_16_);
                        fVar227 = auVar144._0_4_;
                        pGVar4 = (context->scene->geometries).items[uVar82].ptr;
                        if ((pGVar4->mask & (ray->super_RayK<1>).mask) != 0) {
                          fVar227 = fVar227 * 1.5 +
                                    local_a40._0_4_ * -0.5 * fVar227 * fVar227 * fVar227;
                          local_aa0 = auVar9._0_4_;
                          fStack_a9c = auVar9._4_4_;
                          fStack_a98 = auVar9._8_4_;
                          fStack_a94 = auVar9._12_4_;
                          auVar174._0_4_ = fVar227 * local_aa0;
                          auVar174._4_4_ = fVar227 * fStack_a9c;
                          auVar174._8_4_ = fVar227 * fStack_a98;
                          auVar174._12_4_ = fVar227 * fStack_a94;
                          auVar250 = vfmadd213ps_fma(auVar10,auVar174,local_900._0_16_);
                          auVar144 = vshufps_avx(auVar174,auVar174,0xc9);
                          auVar104 = vshufps_avx(local_900._0_16_,local_900._0_16_,0xc9);
                          auVar175._0_4_ = auVar174._0_4_ * auVar104._0_4_;
                          auVar175._4_4_ = auVar174._4_4_ * auVar104._4_4_;
                          auVar175._8_4_ = auVar174._8_4_ * auVar104._8_4_;
                          auVar175._12_4_ = auVar174._12_4_ * auVar104._12_4_;
                          auVar9 = vfmsub231ps_fma(auVar175,local_900._0_16_,auVar144);
                          auVar144 = vshufps_avx(auVar9,auVar9,0xc9);
                          auVar104 = vshufps_avx(auVar250,auVar250,0xc9);
                          auVar9 = vshufps_avx(auVar9,auVar9,0xd2);
                          auVar102._0_4_ = auVar250._0_4_ * auVar9._0_4_;
                          auVar102._4_4_ = auVar250._4_4_ * auVar9._4_4_;
                          auVar102._8_4_ = auVar250._8_4_ * auVar9._8_4_;
                          auVar102._12_4_ = auVar250._12_4_ * auVar9._12_4_;
                          auVar144 = vfmsub231ps_fma(auVar102,auVar144,auVar104);
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            (ray->super_RayK<1>).tfar = fVar188;
                            auVar104 = vshufps_avx(auVar144,auVar144,0xe9);
                            uVar93 = vmovlps_avx(auVar104);
                            *(undefined8 *)&(ray->Ng).field_0 = uVar93;
                            (ray->Ng).field_0.field_0.z = auVar144._0_4_;
                            ray->u = fVar220;
                            ray->v = 0.0;
                            ray->primID = (uint)local_880;
                            ray->geomID = uVar82;
                            ray->instID[0] = context->user->instID[0];
                            ray->instPrimID[0] = context->user->instPrimID[0];
                          }
                          else {
                            auVar104 = vshufps_avx(auVar144,auVar144,0xe9);
                            local_8b0 = vmovlps_avx(auVar104);
                            local_8a8 = auVar144._0_4_;
                            local_8a4 = fVar220;
                            local_8a0 = 0;
                            local_89c = (uint)local_880;
                            local_898 = uVar82;
                            local_894 = context->user->instID[0];
                            local_890 = context->user->instPrimID[0];
                            (ray->super_RayK<1>).tfar = fVar188;
                            local_640._0_4_ = 0xffffffff;
                            local_a78.valid = (int *)local_640;
                            local_a78.geometryUserPtr = pGVar4->userPtr;
                            local_a78.context = context->user;
                            local_a78.hit = (RTCHitN *)&local_8b0;
                            local_a78.N = 1;
                            local_a78.ray = (RTCRayN *)ray;
                            if (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01603e1f:
                              p_Var5 = context->args->filter;
                              if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar226 = ZEXT1664(auVar226._0_16_);
                                auVar243 = ZEXT1664(auVar243._0_16_);
                                auVar262 = ZEXT1664(auVar262._0_16_);
                                auVar273 = ZEXT1664(auVar273._0_16_);
                                (*p_Var5)(&local_a78);
                                if (*local_a78.valid == 0) goto LAB_01603eb0;
                              }
                              (((Vec3f *)((long)local_a78.ray + 0x30))->field_0).components[0] =
                                   *(float *)local_a78.hit;
                              (((Vec3f *)((long)local_a78.ray + 0x30))->field_0).field_0.y =
                                   *(float *)(local_a78.hit + 4);
                              (((Vec3f *)((long)local_a78.ray + 0x30))->field_0).field_0.z =
                                   *(float *)(local_a78.hit + 8);
                              *(float *)((long)local_a78.ray + 0x3c) =
                                   *(float *)(local_a78.hit + 0xc);
                              *(float *)((long)local_a78.ray + 0x40) =
                                   *(float *)(local_a78.hit + 0x10);
                              *(float *)((long)local_a78.ray + 0x44) =
                                   *(float *)(local_a78.hit + 0x14);
                              *(float *)((long)local_a78.ray + 0x48) =
                                   *(float *)(local_a78.hit + 0x18);
                              *(float *)((long)local_a78.ray + 0x4c) =
                                   *(float *)(local_a78.hit + 0x1c);
                              *(float *)((long)local_a78.ray + 0x50) =
                                   *(float *)(local_a78.hit + 0x20);
                            }
                            else {
                              auVar226 = ZEXT1664(auVar226._0_16_);
                              auVar243 = ZEXT1664(auVar243._0_16_);
                              auVar262 = ZEXT1664(local_9e0._0_16_);
                              auVar273 = ZEXT1664(auVar273._0_16_);
                              (*pGVar4->intersectionFilterN)(&local_a78);
                              if (*local_a78.valid != 0) goto LAB_01603e1f;
LAB_01603eb0:
                              (ray->super_RayK<1>).tfar = fVar126;
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                }
                lVar88 = lVar88 + -1;
              } while (lVar88 != 0);
              auVar267 = local_500;
              fVar188 = (ray->super_RayK<1>).tfar;
              auVar120._4_4_ = fVar188;
              auVar120._0_4_ = fVar188;
              auVar120._8_4_ = fVar188;
              auVar120._12_4_ = fVar188;
              auVar120._16_4_ = fVar188;
              auVar120._20_4_ = fVar188;
              auVar120._24_4_ = fVar188;
              auVar120._28_4_ = fVar188;
              auVar110 = vcmpps_avx(_local_760,auVar120,2);
              local_500 = vandps_avx(auVar110,local_500);
              auVar167 = ZEXT3264(local_500);
              auVar267 = auVar267 & auVar110;
            } while ((((((((auVar267 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar267 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar267 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar267 >> 0x7f,0) != '\0') ||
                       (auVar267 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar267 >> 0xbf,0) != '\0') ||
                     (auVar267 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar267[0x1f] < '\0');
            auVar257 = ZEXT3264(_local_580);
            auVar201 = local_280;
            auVar253 = local_620;
            fVar188 = local_5a0;
            fVar126 = fStack_59c;
            fVar220 = fStack_598;
            fVar227 = fStack_594;
            fVar228 = fStack_590;
            fVar229 = fStack_58c;
            fVar230 = fStack_588;
          }
          auVar142._0_4_ = fVar188 * (float)local_7c0._0_4_;
          auVar142._4_4_ = fVar126 * (float)local_7c0._4_4_;
          auVar142._8_4_ = fVar220 * fStack_7b8;
          auVar142._12_4_ = fVar227 * fStack_7b4;
          auVar142._16_4_ = fVar228 * fStack_7b0;
          auVar142._20_4_ = fVar229 * fStack_7ac;
          auVar142._28_36_ = auVar167._28_36_;
          auVar142._24_4_ = fVar230 * fStack_7a8;
          auVar144 = vfmadd213ps_fma(local_7a0,auVar257._0_32_,auVar142._0_32_);
          auVar144 = vfmadd213ps_fma(_local_780,auVar253,ZEXT1632(auVar144));
          auVar59._4_4_ = uStack_73c;
          auVar59._0_4_ = local_740;
          auVar59._8_4_ = uStack_738;
          auVar59._12_4_ = uStack_734;
          auVar59._16_4_ = uStack_730;
          auVar59._20_4_ = uStack_72c;
          auVar59._24_4_ = uStack_728;
          auVar59._28_4_ = uStack_724;
          auVar110 = vandps_avx(ZEXT1632(auVar144),auVar59);
          auVar161._8_4_ = 0x3e99999a;
          auVar161._0_8_ = 0x3e99999a3e99999a;
          auVar161._12_4_ = 0x3e99999a;
          auVar161._16_4_ = 0x3e99999a;
          auVar161._20_4_ = 0x3e99999a;
          auVar161._24_4_ = 0x3e99999a;
          auVar161._28_4_ = 0x3e99999a;
          auVar110 = vcmpps_avx(auVar110,auVar161,1);
          auVar267 = vorps_avx(auVar110,auVar201);
          auVar162._0_4_ = (float)local_820._0_4_ + local_600._0_4_;
          auVar162._4_4_ = (float)local_820._4_4_ + local_600._4_4_;
          auVar162._8_4_ = fStack_818 + local_600._8_4_;
          auVar162._12_4_ = fStack_814 + local_600._12_4_;
          auVar162._16_4_ = fStack_810 + local_600._16_4_;
          auVar162._20_4_ = fStack_80c + local_600._20_4_;
          auVar162._24_4_ = fStack_808 + local_600._24_4_;
          auVar162._28_4_ = fStack_804 + local_600._28_4_;
          auVar110 = vcmpps_avx(auVar162,auVar120,2);
          _local_7c0 = vandps_avx(auVar110,local_540);
          auVar163._8_4_ = 3;
          auVar163._0_8_ = 0x300000003;
          auVar163._12_4_ = 3;
          auVar163._16_4_ = 3;
          auVar163._20_4_ = 3;
          auVar163._24_4_ = 3;
          auVar163._28_4_ = 3;
          auVar186._8_4_ = 2;
          auVar186._0_8_ = 0x200000002;
          auVar186._12_4_ = 2;
          auVar186._16_4_ = 2;
          auVar186._20_4_ = 2;
          auVar186._24_4_ = 2;
          auVar186._28_4_ = 2;
          auVar110 = vblendvps_avx(auVar186,auVar163,auVar267);
          local_7a0 = vpcmpgtd_avx2(auVar110,local_560);
          local_640 = vpandn_avx2(local_7a0,_local_7c0);
          auVar110 = _local_7c0 & ~local_7a0;
          if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar110 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar110 >> 0x7f,0) != '\0') ||
                (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar110 >> 0xbf,0) != '\0') ||
              (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar110[0x1f] < '\0') {
            auVar104 = vminps_avx(local_950,local_970);
            auVar144 = vmaxps_avx(local_950,local_970);
            _local_760 = local_4c0;
            auVar9 = vminps_avx(local_960,_local_980);
            auVar250 = vminps_avx(auVar104,auVar9);
            auVar104 = vmaxps_avx(local_960,_local_980);
            auVar9 = vmaxps_avx(auVar144,auVar104);
            auVar144 = vandps_avx(auVar250,local_990);
            auVar104 = vandps_avx(auVar9,local_990);
            auVar144 = vmaxps_avx(auVar144,auVar104);
            auVar104 = vmovshdup_avx(auVar144);
            auVar104 = vmaxss_avx(auVar104,auVar144);
            auVar144 = vshufpd_avx(auVar144,auVar144,1);
            auVar144 = vmaxss_avx(auVar144,auVar104);
            local_8e0._0_4_ = auVar144._0_4_ * 1.9073486e-06;
            local_6c0._0_16_ = vshufps_avx(auVar9,auVar9,0xff);
            local_780._4_4_ = (float)local_820._4_4_ + local_4c0._4_4_;
            local_780._0_4_ = (float)local_820._0_4_ + local_4c0._0_4_;
            fStack_778 = fStack_818 + local_4c0._8_4_;
            fStack_774 = fStack_814 + local_4c0._12_4_;
            fStack_770 = fStack_810 + local_4c0._16_4_;
            fStack_76c = fStack_80c + local_4c0._20_4_;
            fStack_768 = fStack_808 + local_4c0._24_4_;
            fStack_764 = fStack_804 + local_4c0._28_4_;
            do {
              auVar122._8_4_ = 0x7f800000;
              auVar122._0_8_ = 0x7f8000007f800000;
              auVar122._12_4_ = 0x7f800000;
              auVar122._16_4_ = 0x7f800000;
              auVar122._20_4_ = 0x7f800000;
              auVar122._24_4_ = 0x7f800000;
              auVar122._28_4_ = 0x7f800000;
              auVar110 = vblendvps_avx(auVar122,_local_760,local_640);
              auVar267 = vshufps_avx(auVar110,auVar110,0xb1);
              auVar267 = vminps_avx(auVar110,auVar267);
              auVar223 = vshufpd_avx(auVar267,auVar267,5);
              auVar267 = vminps_avx(auVar267,auVar223);
              auVar223 = vpermpd_avx2(auVar267,0x4e);
              auVar267 = vminps_avx(auVar267,auVar223);
              auVar267 = vcmpps_avx(auVar110,auVar267,0);
              auVar223 = local_640 & auVar267;
              auVar110 = local_640;
              if ((((((((auVar223 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar223 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar223 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar223 >> 0x7f,0) != '\0') ||
                    (auVar223 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar223 >> 0xbf,0) != '\0') ||
                  (auVar223 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar223[0x1f] < '\0') {
                auVar110 = vandps_avx(auVar267,local_640);
              }
              uVar83 = vmovmskps_avx(auVar110);
              iVar14 = 0;
              for (; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x80000000) {
                iVar14 = iVar14 + 1;
              }
              uVar84 = iVar14 << 2;
              *(undefined4 *)(local_640 + uVar84) = 0;
              aVar1 = (ray->super_RayK<1>).dir.field_0;
              local_840._0_16_ = (undefined1  [16])aVar1;
              auVar144 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
              uVar83 = *(uint *)(local_1c0 + uVar84);
              if (auVar144._0_4_ < 0.0) {
                local_a40._0_16_ = ZEXT416(*(uint *)(local_4a0 + uVar84));
                fVar188 = sqrtf(auVar144._0_4_);
                auVar144 = local_a40._0_16_;
              }
              else {
                auVar144 = vsqrtss_avx(auVar144,auVar144);
                fVar188 = auVar144._0_4_;
                auVar144 = ZEXT416(*(uint *)(local_4a0 + uVar84));
              }
              local_680._0_4_ = fVar188 * 1.9073486e-06;
              auVar144 = vinsertps_avx(auVar144,ZEXT416(uVar83),0x10);
              lVar88 = 5;
              do {
                fVar230 = auVar144._0_4_;
                auVar103._4_4_ = fVar230;
                auVar103._0_4_ = fVar230;
                auVar103._8_4_ = fVar230;
                auVar103._12_4_ = fVar230;
                auVar9 = vfmadd213ps_fma(auVar103,local_840._0_16_,_DAT_01f7aa10);
                local_900._0_16_ = vmovshdup_avx(auVar144);
                fVar228 = local_900._0_4_;
                fVar229 = 1.0 - fVar228;
                auVar273 = ZEXT464((uint)fVar229);
                fVar188 = fVar228 * fVar228;
                auVar97 = SUB6416(ZEXT464(0x40400000),0);
                auVar222 = SUB6416(ZEXT464(0xc0a00000),0);
                auVar250 = vfmadd213ss_fma(auVar97,local_900._0_16_,auVar222);
                auVar104 = vfmadd213ss_fma(auVar250,ZEXT416((uint)fVar188),
                                           SUB6416(ZEXT464(0x40000000),0));
                local_a00._0_16_ = ZEXT416((uint)fVar229);
                auVar10 = vfmadd213ss_fma(auVar97,local_a00._0_16_,auVar222);
                auVar10 = vfmadd213ss_fma(auVar10,ZEXT416((uint)(fVar229 * fVar229)),
                                          SUB6416(ZEXT464(0x40000000),0));
                fVar126 = fVar229 * fVar229 * -fVar228 * 0.5;
                fVar220 = auVar104._0_4_ * 0.5;
                fVar227 = auVar10._0_4_ * 0.5;
                fVar228 = fVar228 * fVar228 * -fVar229 * 0.5;
                auVar176._0_4_ = fVar228 * (float)local_980._0_4_;
                auVar176._4_4_ = fVar228 * (float)local_980._4_4_;
                auVar176._8_4_ = fVar228 * fStack_978;
                auVar176._12_4_ = fVar228 * fStack_974;
                auVar194._4_4_ = fVar227;
                auVar194._0_4_ = fVar227;
                auVar194._8_4_ = fVar227;
                auVar194._12_4_ = fVar227;
                auVar104 = vfmadd132ps_fma(auVar194,auVar176,local_960);
                auVar150._4_4_ = fVar220;
                auVar150._0_4_ = fVar220;
                auVar150._8_4_ = fVar220;
                auVar150._12_4_ = fVar220;
                auVar104 = vfmadd132ps_fma(auVar150,auVar104,local_970);
                auVar177._4_4_ = fVar126;
                auVar177._0_4_ = fVar126;
                auVar177._8_4_ = fVar126;
                auVar177._12_4_ = fVar126;
                auVar104 = vfmadd132ps_fma(auVar177,auVar104,local_950);
                auVar222 = vfmadd231ss_fma(auVar222,local_900._0_16_,ZEXT416(0x41100000));
                auVar10 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),local_900._0_16_,
                                          ZEXT416(0x40800000));
                local_920._0_16_ = auVar10;
                local_660._0_16_ = auVar104;
                auVar9 = vsubps_avx(auVar9,auVar104);
                auVar104 = vdpps_avx(auVar9,auVar9,0x7f);
                auVar10 = vfmadd213ss_fma(auVar97,local_900._0_16_,ZEXT416(0xbf800000));
                local_9c0._0_16_ = auVar10;
                local_a40._0_16_ = auVar104;
                if (auVar104._0_4_ < 0.0) {
                  local_9e0._0_4_ = auVar250._0_4_;
                  local_a20._0_4_ = fVar188;
                  local_940._0_16_ = auVar222;
                  local_860._0_4_ = fVar229 * -2.0;
                  auVar167._0_4_ = sqrtf(auVar104._0_4_);
                  auVar167._4_60_ = extraout_var_00;
                  auVar273 = ZEXT1664(local_a00._0_16_);
                  auVar250 = ZEXT416((uint)local_9e0._0_4_);
                  auVar104 = auVar167._0_16_;
                  fVar126 = (float)local_860._0_4_;
                  fVar188 = (float)local_a20._0_4_;
                  auVar222 = local_940._0_16_;
                }
                else {
                  auVar104 = vsqrtss_avx(auVar104,auVar104);
                  fVar126 = fVar229 * -2.0;
                }
                fVar227 = auVar273._0_4_;
                fVar220 = local_900._0_4_;
                auVar10 = vfmadd213ss_fma(auVar250,ZEXT416((uint)(fVar220 + fVar220)),
                                          ZEXT416((uint)(fVar220 * fVar220 * 3.0)));
                auVar128 = SUB6416(ZEXT464(0x40000000),0);
                auVar250 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_900._0_16_,auVar128)
                ;
                auVar97 = vfmadd231ss_fma(ZEXT416((uint)(fVar227 * fVar227 * -3.0)),
                                          ZEXT416((uint)(fVar227 + fVar227)),auVar250);
                auVar95 = auVar273._0_16_;
                auVar96 = vfnmadd231ss_fma(ZEXT416((uint)(fVar220 * (fVar227 + fVar227))),auVar95,
                                           auVar95);
                auVar250 = vfmadd213ss_fma(ZEXT416((uint)fVar126),local_900._0_16_,
                                           ZEXT416((uint)fVar188));
                fVar188 = auVar97._0_4_ * 0.5;
                fVar126 = auVar250._0_4_ * 0.5;
                auVar151._0_4_ = (float)local_980._0_4_ * fVar126;
                auVar151._4_4_ = (float)local_980._4_4_ * fVar126;
                auVar151._8_4_ = fStack_978 * fVar126;
                auVar151._12_4_ = fStack_974 * fVar126;
                auVar134._4_4_ = fVar188;
                auVar134._0_4_ = fVar188;
                auVar134._8_4_ = fVar188;
                auVar134._12_4_ = fVar188;
                auVar250 = vfmadd213ps_fma(auVar134,local_960,auVar151);
                fVar188 = auVar96._0_4_ * 0.5;
                fVar126 = auVar10._0_4_ * 0.5;
                auVar152._4_4_ = fVar126;
                auVar152._0_4_ = fVar126;
                auVar152._8_4_ = fVar126;
                auVar152._12_4_ = fVar126;
                auVar250 = vfmadd213ps_fma(auVar152,local_970,auVar250);
                auVar252._4_4_ = fVar188;
                auVar252._0_4_ = fVar188;
                auVar252._8_4_ = fVar188;
                auVar252._12_4_ = fVar188;
                auVar97 = vfmadd213ps_fma(auVar252,local_950,auVar250);
                auVar143 = vfmadd213ss_fma(local_900._0_16_,SUB6416(ZEXT464(0xc0400000),0),auVar128)
                ;
                auVar262 = ZEXT1664(auVar143);
                auVar105._0_4_ = (float)local_980._0_4_ * (float)local_9c0._0_4_;
                auVar105._4_4_ = (float)local_980._4_4_ * (float)local_9c0._0_4_;
                auVar105._8_4_ = fStack_978 * (float)local_9c0._0_4_;
                auVar105._12_4_ = fStack_974 * (float)local_9c0._0_4_;
                auVar135._4_4_ = local_920._0_4_;
                auVar135._0_4_ = local_920._0_4_;
                auVar135._8_4_ = local_920._0_4_;
                auVar135._12_4_ = local_920._0_4_;
                auVar250 = vfmadd213ps_fma(auVar135,local_960,auVar105);
                uVar92 = auVar222._0_4_;
                auVar153._4_4_ = uVar92;
                auVar153._0_4_ = uVar92;
                auVar153._8_4_ = uVar92;
                auVar153._12_4_ = uVar92;
                auVar250 = vfmadd213ps_fma(auVar153,local_970,auVar250);
                auVar10 = vdpps_avx(auVar97,auVar97,0x7f);
                uVar92 = auVar143._0_4_;
                auVar136._4_4_ = uVar92;
                auVar136._0_4_ = uVar92;
                auVar136._8_4_ = uVar92;
                auVar136._12_4_ = uVar92;
                auVar96 = vfmadd213ps_fma(auVar136,local_950,auVar250);
                auVar250 = vblendps_avx(auVar10,_DAT_01f7aa10,0xe);
                auVar222 = vrsqrtss_avx(auVar250,auVar250);
                fVar220 = auVar10._0_4_;
                fVar188 = auVar222._0_4_;
                auVar222 = vdpps_avx(auVar97,auVar96,0x7f);
                fVar188 = fVar188 * 1.5 + fVar220 * -0.5 * fVar188 * fVar188 * fVar188;
                auVar137._0_4_ = auVar96._0_4_ * fVar220;
                auVar137._4_4_ = auVar96._4_4_ * fVar220;
                auVar137._8_4_ = auVar96._8_4_ * fVar220;
                auVar137._12_4_ = auVar96._12_4_ * fVar220;
                fVar126 = auVar222._0_4_;
                auVar211._0_4_ = auVar97._0_4_ * fVar126;
                auVar211._4_4_ = auVar97._4_4_ * fVar126;
                fVar227 = auVar97._8_4_;
                auVar211._8_4_ = fVar227 * fVar126;
                fVar228 = auVar97._12_4_;
                auVar211._12_4_ = fVar228 * fVar126;
                auVar222 = vsubps_avx(auVar137,auVar211);
                auVar250 = vrcpss_avx(auVar250,auVar250);
                auVar96 = vfnmadd213ss_fma(auVar250,auVar10,auVar128);
                fVar126 = auVar250._0_4_ * auVar96._0_4_;
                auVar250 = vmaxss_avx(ZEXT416((uint)local_8e0._0_4_),
                                      ZEXT416((uint)(fVar230 * (float)local_680._0_4_)));
                local_9e0._0_8_ = auVar97._0_8_ ^ 0x8000000080000000;
                local_9e0._8_4_ = -fVar227;
                local_9e0._12_4_ = -fVar228;
                auVar178._0_4_ = fVar188 * auVar222._0_4_ * fVar126;
                auVar178._4_4_ = fVar188 * auVar222._4_4_ * fVar126;
                auVar178._8_4_ = fVar188 * auVar222._8_4_ * fVar126;
                auVar178._12_4_ = fVar188 * auVar222._12_4_ * fVar126;
                local_a00._0_4_ = auVar97._0_4_ * fVar188;
                local_a00._4_4_ = auVar97._4_4_ * fVar188;
                local_a00._8_4_ = fVar227 * fVar188;
                local_a00._12_4_ = fVar228 * fVar188;
                local_900._0_16_ = auVar97;
                local_920._0_4_ = auVar250._0_4_;
                if (fVar220 < -fVar220) {
                  local_9c0._0_4_ = auVar104._0_4_;
                  local_a20._0_16_ = auVar178;
                  auVar262 = ZEXT1664(auVar143);
                  auVar273 = ZEXT1664(auVar95);
                  fVar188 = sqrtf(fVar220);
                  auVar250 = ZEXT416((uint)local_920._0_4_);
                  auVar104 = ZEXT416((uint)local_9c0._0_4_);
                  auVar178 = local_a20._0_16_;
                }
                else {
                  auVar10 = vsqrtss_avx(auVar10,auVar10);
                  fVar188 = auVar10._0_4_;
                }
                local_9c0._0_16_ = vdpps_avx(auVar9,local_a00._0_16_,0x7f);
                auVar226 = ZEXT1664(local_9c0._0_16_);
                auVar96 = vfmadd213ss_fma(ZEXT416((uint)local_8e0._0_4_),auVar104,auVar250);
                auVar10 = vdpps_avx(local_9e0._0_16_,local_a00._0_16_,0x7f);
                auVar222 = vdpps_avx(auVar9,auVar178,0x7f);
                auVar97 = vdpps_avx(local_840._0_16_,local_a00._0_16_,0x7f);
                auVar96 = vfmadd213ss_fma(ZEXT416((uint)(auVar104._0_4_ + 1.0)),
                                          ZEXT416((uint)((float)local_8e0._0_4_ / fVar188)),auVar96)
                ;
                auVar257 = ZEXT1664(auVar96);
                fVar188 = auVar10._0_4_ + auVar222._0_4_;
                auVar243 = ZEXT464((uint)fVar188);
                auVar106._0_4_ = local_9c0._0_4_ * local_9c0._0_4_;
                auVar106._4_4_ = local_9c0._4_4_ * local_9c0._4_4_;
                auVar106._8_4_ = local_9c0._8_4_ * local_9c0._8_4_;
                auVar106._12_4_ = local_9c0._12_4_ * local_9c0._12_4_;
                auVar104 = vdpps_avx(auVar9,local_9e0._0_16_,0x7f);
                auVar222 = vsubps_avx(local_a40._0_16_,auVar106);
                auVar10 = vrsqrtss_avx(auVar222,auVar222);
                fVar220 = auVar222._0_4_;
                fVar126 = auVar10._0_4_;
                fVar126 = fVar126 * 1.5 + fVar220 * -0.5 * fVar126 * fVar126 * fVar126;
                auVar10 = vdpps_avx(auVar9,local_840._0_16_,0x7f);
                local_9e0._0_16_ = ZEXT416((uint)fVar188);
                local_a00._0_16_ =
                     vfnmadd231ss_fma(auVar104,local_9c0._0_16_,ZEXT416((uint)fVar188));
                auVar104 = vfnmadd231ss_fma(auVar10,local_9c0._0_16_,auVar97);
                if (fVar220 < 0.0) {
                  local_a20._0_4_ = auVar96._0_4_;
                  local_940._0_16_ = auVar97;
                  local_860._0_4_ = fVar126;
                  local_6a0._0_16_ = auVar104;
                  auVar226 = ZEXT1664(local_9c0._0_16_);
                  auVar243 = ZEXT464((uint)fVar188);
                  auVar262 = ZEXT1664(auVar262._0_16_);
                  auVar273 = ZEXT1664(auVar273._0_16_);
                  fVar188 = sqrtf(fVar220);
                  auVar257 = ZEXT464((uint)local_a20._0_4_);
                  auVar250 = ZEXT416((uint)local_920._0_4_);
                  fVar126 = (float)local_860._0_4_;
                  auVar104 = local_6a0._0_16_;
                  auVar97 = local_940._0_16_;
                }
                else {
                  auVar10 = vsqrtss_avx(auVar222,auVar222);
                  fVar188 = auVar10._0_4_;
                }
                auVar10 = vpermilps_avx(local_660._0_16_,0xff);
                fVar188 = fVar188 - auVar10._0_4_;
                auVar222 = vshufps_avx(local_900._0_16_,local_900._0_16_,0xff);
                auVar10 = vfmsub213ss_fma(local_a00._0_16_,ZEXT416((uint)fVar126),auVar222);
                auVar179._0_8_ = auVar97._0_8_ ^ 0x8000000080000000;
                auVar179._8_4_ = auVar97._8_4_ ^ 0x80000000;
                auVar179._12_4_ = auVar97._12_4_ ^ 0x80000000;
                auVar195._0_8_ = auVar10._0_8_ ^ 0x8000000080000000;
                auVar195._8_4_ = auVar10._8_4_ ^ 0x80000000;
                auVar195._12_4_ = auVar10._12_4_ ^ 0x80000000;
                auVar104 = ZEXT416((uint)(auVar104._0_4_ * fVar126));
                auVar10 = vfmsub231ss_fma(ZEXT416((uint)(auVar97._0_4_ * auVar10._0_4_)),
                                          local_9e0._0_16_,auVar104);
                auVar104 = vinsertps_avx(auVar195,auVar104,0x1c);
                uVar92 = auVar10._0_4_;
                auVar196._4_4_ = uVar92;
                auVar196._0_4_ = uVar92;
                auVar196._8_4_ = uVar92;
                auVar196._12_4_ = uVar92;
                auVar104 = vdivps_avx(auVar104,auVar196);
                auVar10 = vinsertps_avx(local_9e0._0_16_,auVar179,0x10);
                auVar10 = vdivps_avx(auVar10,auVar196);
                fVar126 = local_9c0._0_4_;
                auVar154._0_4_ = fVar126 * auVar104._0_4_ + fVar188 * auVar10._0_4_;
                auVar154._4_4_ = fVar126 * auVar104._4_4_ + fVar188 * auVar10._4_4_;
                auVar154._8_4_ = fVar126 * auVar104._8_4_ + fVar188 * auVar10._8_4_;
                auVar154._12_4_ = fVar126 * auVar104._12_4_ + fVar188 * auVar10._12_4_;
                auVar144 = vsubps_avx(auVar144,auVar154);
                auVar104 = vandps_avx(local_9c0._0_16_,local_990);
                if (auVar104._0_4_ < auVar257._0_4_) {
                  auVar250 = vfmadd231ss_fma(ZEXT416((uint)(auVar250._0_4_ + auVar257._0_4_)),
                                             local_6c0._0_16_,ZEXT416(0x36000000));
                  auVar104 = vandps_avx(ZEXT416((uint)fVar188),local_990);
                  if (auVar104._0_4_ < auVar250._0_4_) {
                    fVar188 = auVar144._0_4_ + (float)local_7f0._0_4_;
                    if ((ray->super_RayK<1>).org.field_0.m128[3] <= fVar188) {
                      fVar126 = (ray->super_RayK<1>).tfar;
                      auVar257 = ZEXT464((uint)fVar126);
                      if (fVar188 <= fVar126) {
                        auVar144 = vmovshdup_avx(auVar144);
                        fVar220 = auVar144._0_4_;
                        if ((0.0 <= fVar220) && (fVar220 <= 1.0)) {
                          auVar144 = vrsqrtss_avx(local_a40._0_16_,local_a40._0_16_);
                          fVar227 = auVar144._0_4_;
                          pGVar4 = (context->scene->geometries).items[uVar82].ptr;
                          if ((pGVar4->mask & (ray->super_RayK<1>).mask) != 0) {
                            fVar227 = fVar227 * 1.5 +
                                      local_a40._0_4_ * -0.5 * fVar227 * fVar227 * fVar227;
                            local_aa0 = auVar9._0_4_;
                            fStack_a9c = auVar9._4_4_;
                            fStack_a98 = auVar9._8_4_;
                            fStack_a94 = auVar9._12_4_;
                            auVar180._0_4_ = fVar227 * local_aa0;
                            auVar180._4_4_ = fVar227 * fStack_a9c;
                            auVar180._8_4_ = fVar227 * fStack_a98;
                            auVar180._12_4_ = fVar227 * fStack_a94;
                            auVar250 = vfmadd213ps_fma(auVar222,auVar180,local_900._0_16_);
                            auVar144 = vshufps_avx(auVar180,auVar180,0xc9);
                            auVar104 = vshufps_avx(local_900._0_16_,local_900._0_16_,0xc9);
                            auVar181._0_4_ = auVar180._0_4_ * auVar104._0_4_;
                            auVar181._4_4_ = auVar180._4_4_ * auVar104._4_4_;
                            auVar181._8_4_ = auVar180._8_4_ * auVar104._8_4_;
                            auVar181._12_4_ = auVar180._12_4_ * auVar104._12_4_;
                            auVar9 = vfmsub231ps_fma(auVar181,local_900._0_16_,auVar144);
                            auVar144 = vshufps_avx(auVar9,auVar9,0xc9);
                            auVar104 = vshufps_avx(auVar250,auVar250,0xc9);
                            auVar9 = vshufps_avx(auVar9,auVar9,0xd2);
                            auVar107._0_4_ = auVar250._0_4_ * auVar9._0_4_;
                            auVar107._4_4_ = auVar250._4_4_ * auVar9._4_4_;
                            auVar107._8_4_ = auVar250._8_4_ * auVar9._8_4_;
                            auVar107._12_4_ = auVar250._12_4_ * auVar9._12_4_;
                            auVar144 = vfmsub231ps_fma(auVar107,auVar144,auVar104);
                            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                               (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                              (ray->super_RayK<1>).tfar = fVar188;
                              auVar104 = vshufps_avx(auVar144,auVar144,0xe9);
                              uVar93 = vmovlps_avx(auVar104);
                              *(undefined8 *)&(ray->Ng).field_0 = uVar93;
                              (ray->Ng).field_0.field_0.z = auVar144._0_4_;
                              ray->u = fVar220;
                              ray->v = 0.0;
                              ray->primID = (uint)local_880;
                              ray->geomID = uVar82;
                              ray->instID[0] = context->user->instID[0];
                              ray->instPrimID[0] = context->user->instPrimID[0];
                            }
                            else {
                              auVar104 = vshufps_avx(auVar144,auVar144,0xe9);
                              local_8b0 = vmovlps_avx(auVar104);
                              local_8a8 = auVar144._0_4_;
                              local_8a4 = fVar220;
                              local_8a0 = 0;
                              local_89c = (uint)local_880;
                              local_898 = uVar82;
                              local_894 = context->user->instID[0];
                              local_890 = context->user->instPrimID[0];
                              (ray->super_RayK<1>).tfar = fVar188;
                              local_a44 = -1;
                              local_a78.valid = &local_a44;
                              local_a78.geometryUserPtr = pGVar4->userPtr;
                              local_a78.context = context->user;
                              local_a78.hit = (RTCHitN *)&local_8b0;
                              local_a78.N = 1;
                              local_a78.ray = (RTCRayN *)ray;
                              if (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01604938:
                                p_Var5 = context->args->filter;
                                if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                                  auVar226 = ZEXT1664(auVar226._0_16_);
                                  auVar243 = ZEXT1664(auVar243._0_16_);
                                  auVar257 = ZEXT1664(auVar257._0_16_);
                                  auVar262 = ZEXT1664(auVar262._0_16_);
                                  auVar273 = ZEXT1664(auVar273._0_16_);
                                  (*p_Var5)(&local_a78);
                                  if (*local_a78.valid == 0) goto LAB_016049c9;
                                }
                                (((Vec3f *)((long)local_a78.ray + 0x30))->field_0).components[0] =
                                     *(float *)local_a78.hit;
                                (((Vec3f *)((long)local_a78.ray + 0x30))->field_0).field_0.y =
                                     *(float *)(local_a78.hit + 4);
                                (((Vec3f *)((long)local_a78.ray + 0x30))->field_0).field_0.z =
                                     *(float *)(local_a78.hit + 8);
                                *(float *)((long)local_a78.ray + 0x3c) =
                                     *(float *)(local_a78.hit + 0xc);
                                *(float *)((long)local_a78.ray + 0x40) =
                                     *(float *)(local_a78.hit + 0x10);
                                *(float *)((long)local_a78.ray + 0x44) =
                                     *(float *)(local_a78.hit + 0x14);
                                *(float *)((long)local_a78.ray + 0x48) =
                                     *(float *)(local_a78.hit + 0x18);
                                *(float *)((long)local_a78.ray + 0x4c) =
                                     *(float *)(local_a78.hit + 0x1c);
                                *(float *)((long)local_a78.ray + 0x50) =
                                     *(float *)(local_a78.hit + 0x20);
                              }
                              else {
                                auVar226 = ZEXT1664(auVar226._0_16_);
                                auVar243 = ZEXT1664(auVar243._0_16_);
                                auVar257 = ZEXT464((uint)fVar126);
                                auVar262 = ZEXT1664(auVar262._0_16_);
                                auVar273 = ZEXT1664(auVar273._0_16_);
                                (*pGVar4->intersectionFilterN)(&local_a78);
                                if (*local_a78.valid != 0) goto LAB_01604938;
LAB_016049c9:
                                (ray->super_RayK<1>).tfar = fVar126;
                              }
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                }
                lVar88 = lVar88 + -1;
              } while (lVar88 != 0);
              auVar267 = local_640;
              fVar188 = (ray->super_RayK<1>).tfar;
              auVar120._4_4_ = fVar188;
              auVar120._0_4_ = fVar188;
              auVar120._8_4_ = fVar188;
              auVar120._12_4_ = fVar188;
              auVar120._16_4_ = fVar188;
              auVar120._20_4_ = fVar188;
              auVar120._24_4_ = fVar188;
              auVar120._28_4_ = fVar188;
              auVar110 = vcmpps_avx(_local_780,auVar120,2);
              local_640 = vandps_avx(auVar110,local_640);
              auVar267 = auVar267 & auVar110;
            } while ((((((((auVar267 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar267 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar267 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar267 >> 0x7f,0) != '\0') ||
                       (auVar267 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar267 >> 0xbf,0) != '\0') ||
                     (auVar267 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar267[0x1f] < '\0');
          }
          auVar164._0_4_ = (float)local_820._0_4_ + local_480._0_4_;
          auVar164._4_4_ = (float)local_820._4_4_ + local_480._4_4_;
          auVar164._8_4_ = fStack_818 + local_480._8_4_;
          auVar164._12_4_ = fStack_814 + local_480._12_4_;
          auVar164._16_4_ = fStack_810 + local_480._16_4_;
          auVar164._20_4_ = fStack_80c + local_480._20_4_;
          auVar164._24_4_ = fStack_808 + local_480._24_4_;
          auVar164._28_4_ = fStack_804 + local_480._28_4_;
          auVar267 = vcmpps_avx(auVar164,auVar120,2);
          auVar110 = vandps_avx(local_520,local_5e0);
          auVar110 = vandps_avx(auVar267,auVar110);
          auVar187._0_4_ = (float)local_820._0_4_ + local_4c0._0_4_;
          auVar187._4_4_ = (float)local_820._4_4_ + local_4c0._4_4_;
          auVar187._8_4_ = fStack_818 + local_4c0._8_4_;
          auVar187._12_4_ = fStack_814 + local_4c0._12_4_;
          auVar187._16_4_ = fStack_810 + local_4c0._16_4_;
          auVar187._20_4_ = fStack_80c + local_4c0._20_4_;
          auVar187._24_4_ = fStack_808 + local_4c0._24_4_;
          auVar187._28_4_ = fStack_804 + local_4c0._28_4_;
          auVar223 = vcmpps_avx(auVar187,auVar120,2);
          auVar267 = vandps_avx(_local_7c0,local_7a0);
          auVar267 = vandps_avx(auVar223,auVar267);
          auVar267 = vorps_avx(auVar110,auVar267);
          if ((((((((auVar267 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar267 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar267 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar267 >> 0x7f,0) != '\0') ||
                (auVar267 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar267 >> 0xbf,0) != '\0') ||
              (auVar267 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar267[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar91 * 0x60) = auVar267;
            auVar110 = vblendvps_avx(local_4c0,local_480,auVar110);
            *(undefined1 (*) [32])(auStack_160 + uVar91 * 0x60) = auVar110;
            uVar93 = vmovlps_avx(local_4d0);
            (&uStack_140)[uVar91 * 0xc] = uVar93;
            aiStack_138[uVar91 * 0x18] = local_acc + 1;
            iVar90 = iVar90 + 1;
          }
        }
      }
    }
    fVar188 = (ray->super_RayK<1>).tfar;
    if (iVar90 == 0) break;
    fVar126 = (ray->super_RayK<1>).tfar;
    auVar140._4_4_ = fVar126;
    auVar140._0_4_ = fVar126;
    auVar140._8_4_ = fVar126;
    auVar140._12_4_ = fVar126;
    auVar140._16_4_ = fVar126;
    auVar140._20_4_ = fVar126;
    auVar140._24_4_ = fVar126;
    auVar140._28_4_ = fVar126;
    uVar83 = -iVar90;
    pauVar86 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar90 - 1) * 0x60);
    while( true ) {
      auVar110 = pauVar86[1];
      auVar165._0_4_ = (float)local_820._0_4_ + auVar110._0_4_;
      auVar165._4_4_ = (float)local_820._4_4_ + auVar110._4_4_;
      auVar165._8_4_ = fStack_818 + auVar110._8_4_;
      auVar165._12_4_ = fStack_814 + auVar110._12_4_;
      auVar165._16_4_ = fStack_810 + auVar110._16_4_;
      auVar165._20_4_ = fStack_80c + auVar110._20_4_;
      auVar165._24_4_ = fStack_808 + auVar110._24_4_;
      auVar165._28_4_ = fStack_804 + auVar110._28_4_;
      auVar223 = vcmpps_avx(auVar165,auVar140,2);
      auVar267 = vandps_avx(auVar223,*pauVar86);
      local_480 = auVar267;
      auVar223 = *pauVar86 & auVar223;
      if ((((((((auVar223 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar223 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar223 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar223 >> 0x7f,0) != '\0') ||
            (auVar223 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar223 >> 0xbf,0) != '\0') ||
          (auVar223 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar223[0x1f] < '\0') break;
      pauVar86 = pauVar86 + -3;
      uVar83 = uVar83 + 1;
      if (uVar83 == 0) goto LAB_01604cc6;
    }
    auVar123._8_4_ = 0x7f800000;
    auVar123._0_8_ = 0x7f8000007f800000;
    auVar123._12_4_ = 0x7f800000;
    auVar123._16_4_ = 0x7f800000;
    auVar123._20_4_ = 0x7f800000;
    auVar123._24_4_ = 0x7f800000;
    auVar123._28_4_ = 0x7f800000;
    auVar110 = vblendvps_avx(auVar123,auVar110,auVar267);
    auVar223 = vshufps_avx(auVar110,auVar110,0xb1);
    auVar223 = vminps_avx(auVar110,auVar223);
    auVar11 = vshufpd_avx(auVar223,auVar223,5);
    auVar223 = vminps_avx(auVar223,auVar11);
    auVar11 = vpermpd_avx2(auVar223,0x4e);
    auVar223 = vminps_avx(auVar223,auVar11);
    auVar110 = vcmpps_avx(auVar110,auVar223,0);
    auVar223 = auVar267 & auVar110;
    if ((((((((auVar223 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar223 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar223 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar223 >> 0x7f,0) != '\0') ||
          (auVar223 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar223 >> 0xbf,0) != '\0') ||
        (auVar223 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar223[0x1f] < '\0') {
      auVar267 = vandps_avx(auVar110,auVar267);
    }
    uVar85 = *(ulong *)pauVar86[2];
    auVar108._8_8_ = 0;
    auVar108._0_8_ = uVar85;
    uVar84 = vmovmskps_avx(auVar267);
    iVar90 = 0;
    for (; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000) {
      iVar90 = iVar90 + 1;
    }
    *(undefined4 *)(local_480 + (uint)(iVar90 << 2)) = 0;
    uVar84 = ~uVar83;
    if ((((((((local_480 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_480 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_480 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_480 >> 0x7f,0) != '\0') ||
          (local_480 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_480 >> 0xbf,0) != '\0') ||
        (local_480 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_480[0x1f] < '\0') {
      uVar84 = -uVar83;
    }
    uVar91 = (ulong)uVar84;
    local_acc = *(int *)(pauVar86[2] + 8);
    *pauVar86 = local_480;
    uVar92 = (undefined4)uVar85;
    auVar141._4_4_ = uVar92;
    auVar141._0_4_ = uVar92;
    auVar141._8_4_ = uVar92;
    auVar141._12_4_ = uVar92;
    auVar141._16_4_ = uVar92;
    auVar141._20_4_ = uVar92;
    auVar141._24_4_ = uVar92;
    auVar141._28_4_ = uVar92;
    auVar144 = vmovshdup_avx(auVar108);
    auVar144 = vsubps_avx(auVar144,auVar108);
    auVar124._0_4_ = auVar144._0_4_;
    auVar124._4_4_ = auVar124._0_4_;
    auVar124._8_4_ = auVar124._0_4_;
    auVar124._12_4_ = auVar124._0_4_;
    auVar124._16_4_ = auVar124._0_4_;
    auVar124._20_4_ = auVar124._0_4_;
    auVar124._24_4_ = auVar124._0_4_;
    auVar124._28_4_ = auVar124._0_4_;
    auVar167 = ZEXT3264(_DAT_01faff20);
    auVar144 = vfmadd132ps_fma(auVar124,auVar141,_DAT_01faff20);
    local_4c0 = ZEXT1632(auVar144);
    auVar219 = ZEXT864(*(ulong *)(local_4c0 + (uint)(iVar90 << 2)));
    uVar85 = local_880;
  } while( true );
LAB_01604cc6:
  auVar109._4_4_ = fVar188;
  auVar109._0_4_ = fVar188;
  auVar109._8_4_ = fVar188;
  auVar109._12_4_ = fVar188;
  auVar144 = vcmpps_avx(local_4e0,auVar109,2);
  uVar82 = vmovmskps_avx(auVar144);
  uVar82 = (uint)uVar89 & uVar82;
  if (uVar82 == 0) {
    return;
  }
  goto LAB_0160249d;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }